

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

void ZSTD_initStats_ultra
               (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  uint litLength;
  ZSTD_optimal_t *pZVar1;
  ZSTD_match_t *matches_00;
  ZSTD_optimal_t sol;
  ZSTD_optimal_t sol_00;
  ZSTD_optimal_t sol_01;
  ZSTD_optimal_t sol_02;
  ZSTD_optimal_t sol_03;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  int *piVar17;
  int iVar18;
  U32 UVar19;
  int iVar20;
  U32 UVar21;
  int iVar22;
  uint uVar23;
  U32 UVar24;
  BYTE *pBVar25;
  size_t sVar26;
  ZSTD_optimal_t *pZVar27;
  ZSTD_optimal_t *pZVar28;
  bool bVar29;
  repcodes_t rVar30;
  undefined8 in_stack_ffffffffffffe694;
  uint local_1964;
  U32 local_195c;
  U32 local_1954;
  U32 local_1948;
  U32 local_193c;
  uint local_1934;
  U32 local_192c;
  BYTE *local_1928;
  BYTE *local_1910;
  BYTE *local_18f8;
  U32 local_18e8;
  uint local_18e4;
  uint local_18e0;
  U32 local_18dc;
  U32 local_18d8;
  U32 local_18d4;
  uint local_18d0;
  U32 local_18cc;
  BYTE *local_18c8;
  BYTE *local_18c0;
  ZSTD_compressionParameters *local_18b8;
  ZSTD_matchState_t *local_18b0;
  U32 local_18a8;
  U32 local_18a4;
  uint local_1894;
  BYTE *local_1890;
  BYTE *local_1878;
  BYTE *local_1860;
  U32 local_1850;
  uint local_184c;
  uint local_1848;
  U32 local_1844;
  U32 local_1840;
  U32 local_183c;
  uint local_1838;
  U32 local_1834;
  BYTE *local_1830;
  BYTE *local_1828;
  ZSTD_compressionParameters *local_1820;
  ZSTD_matchState_t *local_1818;
  U32 local_1810;
  U32 local_180c;
  uint local_17fc;
  BYTE *local_17f8;
  BYTE *local_17e0;
  BYTE *local_17c8;
  U32 local_17b8;
  uint local_17b4;
  uint local_17b0;
  U32 local_17ac;
  U32 local_17a8;
  U32 local_17a4;
  uint local_17a0;
  U32 local_179c;
  BYTE *local_1798;
  BYTE *local_1790;
  ZSTD_compressionParameters *local_1788;
  ZSTD_matchState_t *local_1780;
  U32 local_1778;
  U32 local_1774;
  uint local_1764;
  BYTE *local_1760;
  BYTE *local_1748;
  BYTE *local_1730;
  U32 local_1720;
  uint local_171c;
  uint local_1718;
  U32 local_1714;
  U32 local_1710;
  U32 local_170c;
  uint local_1708;
  U32 local_1704;
  BYTE *local_1700;
  BYTE *local_16f8;
  ZSTD_compressionParameters *local_16f0;
  ZSTD_matchState_t *local_16e8;
  U32 local_16e0;
  U32 local_16dc;
  uint local_16cc;
  U32 local_16bc;
  U32 local_16ac;
  U32 local_16a8;
  U32 local_169c;
  U32 local_1690;
  BYTE *local_1688;
  BYTE *local_1670;
  BYTE *local_1658;
  U32 local_1648;
  uint local_1644;
  uint local_1640;
  U32 local_163c;
  U32 local_1638;
  U32 local_1634;
  uint local_1630;
  U32 local_162c;
  BYTE *local_1628;
  BYTE *local_1620;
  ZSTD_compressionParameters *local_1618;
  ZSTD_matchState_t *local_1610;
  U32 local_1608;
  U32 local_1604;
  uint local_15f4;
  BYTE *local_15f0;
  BYTE *local_15d8;
  BYTE *local_15c0;
  U32 local_15b0;
  uint local_15ac;
  uint local_15a8;
  U32 local_15a4;
  U32 local_15a0;
  U32 local_159c;
  uint local_1598;
  U32 local_1594;
  BYTE *local_1590;
  BYTE *local_1588;
  ZSTD_compressionParameters *local_1580;
  ZSTD_matchState_t *local_1578;
  U32 local_1570;
  U32 local_156c;
  uint local_155c;
  BYTE *local_1558;
  BYTE *local_1540;
  BYTE *local_1528;
  U32 local_1518;
  uint local_1514;
  uint local_1510;
  U32 local_150c;
  U32 local_1508;
  U32 local_1504;
  uint local_1500;
  U32 local_14fc;
  BYTE *local_14f8;
  BYTE *local_14f0;
  ZSTD_compressionParameters *local_14e8;
  ZSTD_matchState_t *local_14e0;
  U32 local_14d8;
  U32 local_14d4;
  uint local_14c4;
  BYTE *local_14c0;
  BYTE *local_14a8;
  BYTE *local_1490;
  U32 local_1480;
  uint local_147c;
  uint local_1478;
  U32 local_1474;
  U32 local_1470;
  U32 local_146c;
  uint local_1468;
  U32 local_1464;
  BYTE *local_1460;
  BYTE *local_1458;
  ZSTD_compressionParameters *local_1450;
  ZSTD_matchState_t *local_1448;
  U32 local_1440;
  U32 local_143c;
  uint local_142c;
  uint local_1420;
  undefined8 local_141c;
  U32 tmpRep [3];
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 advance;
  U32 offCode_2;
  U32 mlen_9;
  U32 llen;
  U32 storePos;
  uint local_13ac;
  U32 backDist;
  U32 seqPos;
  U32 storeStart;
  U32 storeEnd;
  U32 local_1398;
  repcodes_t reps;
  int price_2;
  U32 pos_1;
  U32 mlen_8;
  U32 startML;
  U32 lastML;
  U32 offset_1;
  U32 maxML_1;
  U32 matchNb_1;
  U32 nbMatches_1;
  U32 basePrice;
  U32 previousPrice;
  U32 litlen_2;
  U32 ll0_1;
  U32 local_1348;
  undefined8 local_1340;
  repcodes_t newReps;
  U32 prev;
  int price_1;
  U32 litlen_1;
  BYTE *inr;
  U32 sequencePrice;
  U32 matchPrice;
  U32 end;
  U32 offset;
  U32 matchNb;
  U32 pos;
  U32 literalsPrice;
  U32 maxOffset;
  U32 maxML;
  U32 i;
  U32 nbMatches;
  U32 ll0;
  U32 litlen;
  U32 last_pos;
  U32 cur;
  ZSTD_optLdm_t optLdm;
  ZSTD_optimal_t lastSequence;
  ZSTD_match_t *matches;
  ZSTD_optimal_t *opt;
  uint local_1270;
  U32 nextToUpdate3;
  U32 minMatch;
  U32 sufficient_len;
  ZSTD_compressionParameters *cParams;
  BYTE *prefixStart;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  optState_t *optStatePtr;
  size_t local_1218;
  BYTE *local_1210;
  int *local_1208;
  seqStore_t *local_1200;
  ZSTD_matchState_t *local_11f8;
  uint local_11ec;
  ZSTD_compressionParameters *pZStack_11e8;
  U32 matchLengthSearch_1;
  ZSTD_compressionParameters *cParams_6;
  U32 *local_11d8;
  int local_11cc;
  BYTE *local_11c8;
  BYTE *local_11c0;
  U32 *local_11b8;
  ZSTD_matchState_t *local_11b0;
  ZSTD_match_t *local_11a8;
  U32 local_11a0;
  U32 local_119c;
  uint local_1198;
  U32 forward_1;
  U32 idx_1;
  U32 target_1;
  BYTE *base_6;
  BYTE *local_1180;
  BYTE *local_1178;
  ZSTD_matchState_t *local_1170;
  uint local_1164;
  ZSTD_compressionParameters *pZStack_1160;
  U32 matchLengthSearch;
  ZSTD_compressionParameters *cParams_1;
  int *local_1150;
  int local_1144;
  BYTE *local_1140;
  BYTE *local_1138;
  U32 *local_1130;
  ZSTD_matchState_t *local_1128;
  ZSTD_match_t *local_1120;
  U32 local_1118;
  U32 local_1114;
  uint local_1110;
  U32 forward;
  U32 idx;
  U32 target;
  BYTE *base_1;
  BYTE *local_10f8;
  BYTE *local_10f0;
  ZSTD_matchState_t *local_10e8;
  U32 local_10dc;
  U32 local_10d8;
  U32 mlCode;
  U32 mlBase;
  U32 offCode;
  U32 price;
  U32 local_10c0;
  U32 local_10bc;
  U32 local_10b8;
  U32 local_10b4;
  U32 local_10b0;
  U32 mlCode_1;
  U32 mlBase_1;
  U32 offCode_1;
  U32 price_3;
  int local_1094;
  U32 local_1090;
  U32 local_108c;
  BYTE *local_1088;
  BYTE *litEnd;
  BYTE *litLimit_w;
  U32 local_106c;
  BYTE *local_1068;
  BYTE *local_1060;
  ulong local_1058;
  seqStore_t *local_1050;
  BYTE *local_1048;
  BYTE *match_3;
  size_t matchLength_1;
  U32 *nextPtr_1;
  U32 *dmsBt;
  size_t sStack_1020;
  U32 dictMatchIndex;
  size_t dmsH;
  size_t matchLength;
  BYTE *match_2;
  U32 *nextPtr;
  BYTE *match_1;
  BYTE *match;
  size_t mlen;
  BYTE *pBStack_fe0;
  U32 matchIndex3;
  BYTE *repMatch;
  uint local_fd0;
  U32 repLen;
  U32 repIndex;
  U32 repOffset;
  U32 repCode;
  U32 lastR;
  size_t bestLength;
  uint local_fb0;
  U32 dmsBtLow;
  U32 dmsBtMask;
  U32 dmsBtLog;
  U32 dmsHashLog;
  U32 dmsIndexDelta;
  U32 dmsLowLimit;
  U32 dmsHighLimit;
  BYTE *dmsEnd;
  BYTE *dmsBase;
  ZSTD_compressionParameters *dmsCParams;
  ZSTD_matchState_t *dms;
  U32 nbCompares;
  U32 mnum;
  U32 dummy32;
  U32 matchEndIdx;
  U32 *largerPtr;
  U32 *smallerPtr;
  uint local_f50;
  U32 matchLow;
  U32 windowLow;
  U32 btLow;
  BYTE *prefixStart_1;
  BYTE *dictEnd;
  BYTE *pBStack_f30;
  U32 dictLimit;
  BYTE *dictBase;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  size_t sStack_f00;
  U32 matchIndex;
  size_t h;
  U32 *hashTable;
  U32 local_ee8;
  U32 minMatch_1;
  U32 hashLog;
  U32 curr;
  BYTE *base_2;
  ZSTD_compressionParameters *pZStack_ed0;
  U32 sufficient_len_1;
  ZSTD_compressionParameters *cParams_2;
  uint local_ec0;
  uint local_ebc;
  int *local_eb8;
  int local_eac;
  BYTE *local_ea8;
  BYTE *local_ea0;
  U32 *local_e98;
  ZSTD_matchState_t *local_e90;
  ZSTD_match_t *local_e88;
  U32 local_e7c;
  uint local_e78;
  U32 local_e74;
  BYTE *local_e70;
  size_t local_e68;
  undefined4 local_e60;
  U32 local_e5c;
  BYTE *local_e58;
  size_t local_e50;
  BYTE *local_e48;
  BYTE *match_7;
  size_t matchLength_3;
  U32 *nextPtr_3;
  U32 *dmsBt_1;
  size_t sStack_e20;
  U32 dictMatchIndex_1;
  size_t dmsH_1;
  size_t matchLength_2;
  BYTE *match_6;
  U32 *nextPtr_2;
  BYTE *match_5;
  BYTE *match_4;
  size_t mlen_1;
  BYTE *pBStack_de0;
  U32 matchIndex3_1;
  BYTE *repMatch_1;
  uint local_dd0;
  U32 repLen_1;
  U32 repIndex_1;
  U32 repOffset_1;
  U32 repCode_1;
  U32 lastR_1;
  size_t bestLength_1;
  uint local_db0;
  U32 dmsBtLow_1;
  U32 dmsBtMask_1;
  U32 dmsBtLog_1;
  U32 dmsHashLog_1;
  U32 dmsIndexDelta_1;
  U32 dmsLowLimit_1;
  U32 dmsHighLimit_1;
  BYTE *dmsEnd_1;
  BYTE *dmsBase_1;
  ZSTD_compressionParameters *dmsCParams_1;
  ZSTD_matchState_t *dms_1;
  U32 nbCompares_1;
  U32 mnum_1;
  U32 dummy32_1;
  U32 matchEndIdx_1;
  U32 *largerPtr_1;
  U32 *smallerPtr_1;
  uint local_d50;
  U32 matchLow_1;
  U32 windowLow_1;
  U32 btLow_1;
  BYTE *prefixStart_2;
  BYTE *dictEnd_1;
  BYTE *pBStack_d30;
  U32 dictLimit_1;
  BYTE *dictBase_1;
  size_t commonLengthLarger_1;
  size_t commonLengthSmaller_1;
  U32 btMask_1;
  U32 btLog_1;
  U32 *bt_1;
  size_t sStack_d00;
  U32 matchIndex_1;
  size_t h_1;
  U32 *hashTable_1;
  U32 local_ce8;
  U32 minMatch_2;
  U32 hashLog_1;
  U32 curr_1;
  BYTE *base_3;
  ZSTD_compressionParameters *pZStack_cd0;
  U32 sufficient_len_2;
  ZSTD_compressionParameters *cParams_3;
  uint local_cc0;
  uint local_cbc;
  int *local_cb8;
  int local_cac;
  BYTE *local_ca8;
  BYTE *local_ca0;
  U32 *local_c98;
  ZSTD_matchState_t *local_c90;
  ZSTD_match_t *local_c88;
  U32 local_c7c;
  uint local_c78;
  U32 local_c74;
  BYTE *local_c70;
  size_t local_c68;
  undefined4 local_c60;
  U32 local_c5c;
  BYTE *local_c58;
  size_t local_c50;
  BYTE *local_c48;
  BYTE *match_11;
  size_t matchLength_5;
  U32 *nextPtr_5;
  U32 *dmsBt_2;
  size_t sStack_c20;
  U32 dictMatchIndex_2;
  size_t dmsH_2;
  size_t matchLength_4;
  BYTE *match_10;
  U32 *nextPtr_4;
  BYTE *match_9;
  BYTE *match_8;
  size_t mlen_2;
  BYTE *pBStack_be0;
  U32 matchIndex3_2;
  BYTE *repMatch_2;
  uint local_bd0;
  U32 repLen_2;
  U32 repIndex_2;
  U32 repOffset_2;
  U32 repCode_2;
  U32 lastR_2;
  size_t bestLength_2;
  uint local_bb0;
  U32 dmsBtLow_2;
  U32 dmsBtMask_2;
  U32 dmsBtLog_2;
  U32 dmsHashLog_2;
  U32 dmsIndexDelta_2;
  U32 dmsLowLimit_2;
  U32 dmsHighLimit_2;
  BYTE *dmsEnd_2;
  BYTE *dmsBase_2;
  ZSTD_compressionParameters *dmsCParams_2;
  ZSTD_matchState_t *dms_2;
  U32 nbCompares_2;
  U32 mnum_2;
  U32 dummy32_2;
  U32 matchEndIdx_2;
  U32 *largerPtr_2;
  U32 *smallerPtr_2;
  uint local_b50;
  U32 matchLow_2;
  U32 windowLow_2;
  U32 btLow_2;
  BYTE *prefixStart_3;
  BYTE *dictEnd_2;
  BYTE *pBStack_b30;
  U32 dictLimit_2;
  BYTE *dictBase_2;
  size_t commonLengthLarger_2;
  size_t commonLengthSmaller_2;
  U32 btMask_2;
  U32 btLog_2;
  U32 *bt_2;
  size_t sStack_b00;
  U32 matchIndex_2;
  size_t h_2;
  U32 *hashTable_2;
  U32 local_ae8;
  U32 minMatch_3;
  U32 hashLog_2;
  U32 curr_2;
  BYTE *base_4;
  ZSTD_compressionParameters *pZStack_ad0;
  U32 sufficient_len_3;
  ZSTD_compressionParameters *cParams_4;
  uint local_ac0;
  uint local_abc;
  int *local_ab8;
  int local_aac;
  BYTE *local_aa8;
  BYTE *local_aa0;
  U32 *local_a98;
  ZSTD_matchState_t *local_a90;
  ZSTD_match_t *local_a88;
  U32 local_a7c;
  uint local_a78;
  U32 local_a74;
  BYTE *local_a70;
  size_t local_a68;
  undefined4 local_a60;
  U32 local_a5c;
  BYTE *local_a58;
  size_t local_a50;
  BYTE *local_a48;
  BYTE *match_15;
  size_t matchLength_7;
  U32 *nextPtr_7;
  U32 *dmsBt_3;
  size_t sStack_a20;
  U32 dictMatchIndex_3;
  size_t dmsH_3;
  size_t matchLength_6;
  BYTE *match_14;
  U32 *nextPtr_6;
  BYTE *match_13;
  BYTE *match_12;
  size_t mlen_3;
  BYTE *pBStack_9e0;
  U32 matchIndex3_3;
  BYTE *repMatch_3;
  uint local_9d0;
  U32 repLen_3;
  U32 repIndex_3;
  U32 repOffset_3;
  U32 repCode_3;
  U32 lastR_3;
  size_t bestLength_3;
  uint local_9b0;
  U32 dmsBtLow_3;
  U32 dmsBtMask_3;
  U32 dmsBtLog_3;
  U32 dmsHashLog_3;
  U32 dmsIndexDelta_3;
  U32 dmsLowLimit_3;
  U32 dmsHighLimit_3;
  BYTE *dmsEnd_3;
  BYTE *dmsBase_3;
  ZSTD_compressionParameters *dmsCParams_3;
  ZSTD_matchState_t *dms_3;
  U32 nbCompares_3;
  U32 mnum_3;
  U32 dummy32_3;
  U32 matchEndIdx_3;
  U32 *largerPtr_3;
  U32 *smallerPtr_3;
  uint local_950;
  U32 matchLow_3;
  U32 windowLow_3;
  U32 btLow_3;
  BYTE *prefixStart_4;
  BYTE *dictEnd_3;
  BYTE *pBStack_930;
  U32 dictLimit_3;
  BYTE *dictBase_3;
  size_t commonLengthLarger_3;
  size_t commonLengthSmaller_3;
  U32 btMask_3;
  U32 btLog_3;
  U32 *bt_3;
  size_t sStack_900;
  U32 matchIndex_3;
  size_t h_3;
  U32 *hashTable_3;
  U32 local_8e8;
  U32 minMatch_4;
  U32 hashLog_3;
  U32 curr_3;
  BYTE *base_5;
  ZSTD_compressionParameters *pZStack_8d0;
  U32 sufficient_len_4;
  ZSTD_compressionParameters *cParams_5;
  uint local_8c0;
  uint local_8bc;
  int *local_8b8;
  int local_8ac;
  BYTE *local_8a8;
  BYTE *local_8a0;
  U32 *local_898;
  ZSTD_matchState_t *local_890;
  ZSTD_match_t *local_888;
  U32 local_87c;
  uint local_878;
  U32 local_874;
  BYTE *local_870;
  size_t local_868;
  undefined4 local_860;
  U32 local_85c;
  BYTE *local_858;
  size_t local_850;
  BYTE *local_848;
  BYTE *match_19;
  size_t matchLength_9;
  U32 *nextPtr_9;
  U32 *dmsBt_4;
  size_t sStack_820;
  U32 dictMatchIndex_4;
  size_t dmsH_4;
  size_t matchLength_8;
  BYTE *match_18;
  U32 *nextPtr_8;
  BYTE *match_17;
  BYTE *match_16;
  size_t mlen_4;
  BYTE *pBStack_7e0;
  U32 matchIndex3_4;
  BYTE *repMatch_4;
  uint local_7d0;
  U32 repLen_4;
  U32 repIndex_4;
  U32 repOffset_4;
  U32 repCode_4;
  U32 lastR_4;
  size_t bestLength_4;
  uint local_7b0;
  U32 dmsBtLow_4;
  U32 dmsBtMask_4;
  U32 dmsBtLog_4;
  U32 dmsHashLog_4;
  U32 dmsIndexDelta_4;
  U32 dmsLowLimit_4;
  U32 dmsHighLimit_4;
  BYTE *dmsEnd_4;
  BYTE *dmsBase_4;
  ZSTD_compressionParameters *dmsCParams_4;
  ZSTD_matchState_t *dms_4;
  U32 nbCompares_4;
  U32 mnum_4;
  U32 dummy32_4;
  U32 matchEndIdx_4;
  U32 *largerPtr_4;
  U32 *smallerPtr_4;
  uint local_750;
  U32 matchLow_4;
  U32 windowLow_4;
  U32 btLow_4;
  BYTE *prefixStart_5;
  BYTE *dictEnd_4;
  BYTE *pBStack_730;
  U32 dictLimit_4;
  BYTE *dictBase_4;
  size_t commonLengthLarger_4;
  size_t commonLengthSmaller_4;
  U32 btMask_4;
  U32 btLog_4;
  U32 *bt_4;
  size_t sStack_700;
  U32 matchIndex_4;
  size_t h_4;
  U32 *hashTable_4;
  U32 local_6e8;
  U32 minMatch_5;
  U32 hashLog_4;
  U32 curr_4;
  BYTE *base_7;
  ZSTD_compressionParameters *pZStack_6d0;
  U32 sufficient_len_5;
  ZSTD_compressionParameters *cParams_7;
  uint local_6c0;
  U32 local_6bc;
  U32 *local_6b8;
  int local_6ac;
  BYTE *local_6a8;
  BYTE *local_6a0;
  U32 *local_698;
  ZSTD_matchState_t *local_690;
  ZSTD_match_t *local_688;
  U32 local_67c;
  uint local_678;
  U32 local_674;
  BYTE *local_670;
  size_t local_668;
  undefined4 local_660;
  U32 local_65c;
  BYTE *local_658;
  size_t local_650;
  BYTE *local_648;
  BYTE *match_23;
  size_t matchLength_11;
  U32 *nextPtr_11;
  U32 *dmsBt_5;
  size_t sStack_620;
  U32 dictMatchIndex_5;
  size_t dmsH_5;
  size_t matchLength_10;
  BYTE *match_22;
  U32 *nextPtr_10;
  BYTE *match_21;
  BYTE *match_20;
  size_t mlen_5;
  BYTE *pBStack_5e0;
  U32 matchIndex3_5;
  BYTE *repMatch_5;
  uint local_5d0;
  U32 repLen_5;
  U32 repIndex_5;
  U32 repOffset_5;
  U32 repCode_5;
  U32 lastR_5;
  size_t bestLength_5;
  uint local_5b0;
  U32 dmsBtLow_5;
  U32 dmsBtMask_5;
  U32 dmsBtLog_5;
  U32 dmsHashLog_5;
  U32 dmsIndexDelta_5;
  U32 dmsLowLimit_5;
  U32 dmsHighLimit_5;
  BYTE *dmsEnd_5;
  BYTE *dmsBase_5;
  ZSTD_compressionParameters *dmsCParams_5;
  ZSTD_matchState_t *dms_5;
  U32 nbCompares_5;
  U32 mnum_5;
  U32 dummy32_5;
  U32 matchEndIdx_5;
  U32 *largerPtr_5;
  U32 *smallerPtr_5;
  uint local_550;
  U32 matchLow_5;
  U32 windowLow_5;
  U32 btLow_5;
  BYTE *prefixStart_6;
  BYTE *dictEnd_5;
  BYTE *pBStack_530;
  U32 dictLimit_5;
  BYTE *dictBase_5;
  size_t commonLengthLarger_5;
  size_t commonLengthSmaller_5;
  U32 btMask_5;
  U32 btLog_5;
  U32 *bt_5;
  size_t sStack_500;
  U32 matchIndex_5;
  size_t h_5;
  U32 *hashTable_5;
  U32 local_4e8;
  U32 minMatch_6;
  U32 hashLog_5;
  U32 curr_5;
  BYTE *base_8;
  ZSTD_compressionParameters *pZStack_4d0;
  U32 sufficient_len_6;
  ZSTD_compressionParameters *cParams_8;
  uint local_4c0;
  U32 local_4bc;
  U32 *local_4b8;
  int local_4ac;
  BYTE *local_4a8;
  BYTE *local_4a0;
  U32 *local_498;
  ZSTD_matchState_t *local_490;
  ZSTD_match_t *local_488;
  U32 local_47c;
  uint local_478;
  U32 local_474;
  BYTE *local_470;
  size_t local_468;
  undefined4 local_460;
  U32 local_45c;
  BYTE *local_458;
  size_t local_450;
  BYTE *local_448;
  BYTE *match_27;
  size_t matchLength_13;
  U32 *nextPtr_13;
  U32 *dmsBt_6;
  size_t sStack_420;
  U32 dictMatchIndex_6;
  size_t dmsH_6;
  size_t matchLength_12;
  BYTE *match_26;
  U32 *nextPtr_12;
  BYTE *match_25;
  BYTE *match_24;
  size_t mlen_6;
  BYTE *pBStack_3e0;
  U32 matchIndex3_6;
  BYTE *repMatch_6;
  uint local_3d0;
  U32 repLen_6;
  U32 repIndex_6;
  U32 repOffset_6;
  U32 repCode_6;
  U32 lastR_6;
  size_t bestLength_6;
  uint local_3b0;
  U32 dmsBtLow_6;
  U32 dmsBtMask_6;
  U32 dmsBtLog_6;
  U32 dmsHashLog_6;
  U32 dmsIndexDelta_6;
  U32 dmsLowLimit_6;
  U32 dmsHighLimit_6;
  BYTE *dmsEnd_6;
  BYTE *dmsBase_6;
  ZSTD_compressionParameters *dmsCParams_6;
  ZSTD_matchState_t *dms_6;
  U32 nbCompares_6;
  U32 mnum_6;
  U32 dummy32_6;
  U32 matchEndIdx_6;
  U32 *largerPtr_6;
  U32 *smallerPtr_6;
  uint local_350;
  U32 matchLow_6;
  U32 windowLow_6;
  U32 btLow_6;
  BYTE *prefixStart_7;
  BYTE *dictEnd_6;
  BYTE *pBStack_330;
  U32 dictLimit_6;
  BYTE *dictBase_6;
  size_t commonLengthLarger_6;
  size_t commonLengthSmaller_6;
  U32 btMask_6;
  U32 btLog_6;
  U32 *bt_6;
  size_t sStack_300;
  U32 matchIndex_6;
  size_t h_6;
  U32 *hashTable_6;
  U32 local_2e8;
  U32 minMatch_7;
  U32 hashLog_6;
  U32 curr_6;
  BYTE *base_9;
  ZSTD_compressionParameters *pZStack_2d0;
  U32 sufficient_len_7;
  ZSTD_compressionParameters *cParams_9;
  uint local_2c0;
  U32 local_2bc;
  U32 *local_2b8;
  int local_2ac;
  BYTE *local_2a8;
  BYTE *local_2a0;
  U32 *local_298;
  ZSTD_matchState_t *local_290;
  ZSTD_match_t *local_288;
  U32 local_27c;
  uint local_278;
  U32 local_274;
  BYTE *local_270;
  size_t local_268;
  undefined4 local_260;
  U32 local_25c;
  BYTE *local_258;
  size_t local_250;
  BYTE *local_248;
  BYTE *match_31;
  size_t matchLength_15;
  U32 *nextPtr_15;
  U32 *dmsBt_7;
  size_t sStack_220;
  U32 dictMatchIndex_7;
  size_t dmsH_7;
  size_t matchLength_14;
  BYTE *match_30;
  U32 *nextPtr_14;
  BYTE *match_29;
  BYTE *match_28;
  size_t mlen_7;
  BYTE *pBStack_1e0;
  U32 matchIndex3_7;
  BYTE *repMatch_7;
  uint local_1d0;
  U32 repLen_7;
  U32 repIndex_7;
  U32 repOffset_7;
  U32 repCode_7;
  U32 lastR_7;
  size_t bestLength_7;
  uint local_1b0;
  U32 dmsBtLow_7;
  U32 dmsBtMask_7;
  U32 dmsBtLog_7;
  U32 dmsHashLog_7;
  U32 dmsIndexDelta_7;
  U32 dmsLowLimit_7;
  U32 dmsHighLimit_7;
  BYTE *dmsEnd_7;
  BYTE *dmsBase_7;
  ZSTD_compressionParameters *dmsCParams_7;
  ZSTD_matchState_t *dms_7;
  U32 nbCompares_7;
  U32 mnum_7;
  U32 dummy32_7;
  U32 matchEndIdx_7;
  U32 *largerPtr_7;
  U32 *smallerPtr_7;
  uint local_150;
  U32 matchLow_7;
  U32 windowLow_7;
  U32 btLow_7;
  BYTE *prefixStart_8;
  BYTE *dictEnd_7;
  BYTE *pBStack_130;
  U32 dictLimit_7;
  BYTE *dictBase_7;
  size_t commonLengthLarger_7;
  size_t commonLengthSmaller_7;
  U32 btMask_7;
  U32 btLog_7;
  U32 *bt_7;
  size_t sStack_100;
  U32 matchIndex_7;
  size_t h_7;
  U32 *hashTable_7;
  U32 local_e8;
  U32 minMatch_8;
  U32 hashLog_7;
  U32 curr_7;
  BYTE *base_10;
  ZSTD_compressionParameters *pZStack_d0;
  U32 sufficient_len_8;
  ZSTD_compressionParameters *cParams_10;
  uint local_c0;
  U32 local_bc;
  U32 *local_b8;
  int local_ac;
  BYTE *local_a8;
  BYTE *local_a0;
  U32 *local_98;
  ZSTD_matchState_t *local_90;
  ZSTD_match_t *local_88;
  U32 local_7c;
  uint local_78;
  U32 local_74;
  BYTE *local_70;
  size_t local_68;
  undefined4 local_60;
  U32 local_5c;
  BYTE *local_58;
  size_t local_50;
  BYTE *local_48;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  long local_20;
  BYTE *local_18;
  BYTE *local_10;
  
  local_141c = *(undefined8 *)rep;
  tmpRep[0] = rep[2];
  local_1208 = (int *)&local_141c;
  optStatePtr._4_4_ = 2;
  optStatePtr._0_4_ = 0;
  istart = (BYTE *)&ms->opt;
  ilimit = (BYTE *)((long)src + srcSize);
  base = ilimit + -8;
  prefixStart = (ms->window).base;
  cParams = (ZSTD_compressionParameters *)(prefixStart + (ms->window).dictLimit);
  _minMatch = &ms->cParams;
  if ((ms->cParams).targetLength < 0xfff) {
    local_1420 = (ms->cParams).targetLength;
  }
  else {
    local_1420 = 0xfff;
  }
  nextToUpdate3 = local_1420;
  local_1270 = 4;
  if ((ms->cParams).minMatch == 3) {
    local_1270 = 3;
  }
  opt._4_4_ = ms->nextToUpdate;
  pZVar1 = (ms->opt).priceTable;
  matches_00 = (ms->opt).matchTable;
  tmpRep._4_8_ = srcSize;
  iend = (BYTE *)src;
  anchor = (BYTE *)src;
  ip = (BYTE *)src;
  local_1218 = srcSize;
  local_1210 = (BYTE *)src;
  local_1200 = seqStore;
  local_11f8 = ms;
  if (ms->ldmSeqStore == (rawSeqStore_t *)0x0) {
    memcpy(&last_pos,&kNullRawSeqStore,0x28);
  }
  else {
    memcpy(&last_pos,ms->ldmSeqStore,0x28);
  }
  optLdm.startPosInBlock = 0;
  optLdm.seqStore.capacity._0_4_ = 0;
  optLdm.seqStore.capacity._4_4_ = 0;
  ZSTD_opt_getNextMatchAndUpdateSeqStore
            ((ZSTD_optLdm_t *)&last_pos,(int)anchor - (int)ip,(int)ilimit - (int)anchor);
  ZSTD_rescaleFreqs((optState_t *)istart,local_1210,local_1218,optStatePtr._4_4_);
  anchor = anchor + (int)(uint)((ZSTD_compressionParameters *)anchor == cParams);
  do {
    if (base <= anchor) {
      ZSTD_resetSeqStore(seqStore);
      (ms->window).base = (ms->window).base + -tmpRep._4_8_;
      (ms->window).dictLimit = (U32)tmpRep._4_8_ + (ms->window).dictLimit;
      (ms->window).lowLimit = (ms->window).dictLimit;
      ms->nextToUpdate = (ms->window).dictLimit;
      ZSTD_upscaleStats(&ms->opt);
      return;
    }
    ll0 = 0;
    nbMatches = (int)anchor - (int)iend;
    i = (U32)((nbMatches != 0 ^ 0xffU) & 1);
    local_1128 = local_11f8;
    local_1130 = (U32 *)((long)&opt + 4);
    local_1138 = anchor;
    local_1140 = ilimit;
    local_1144 = (int)optStatePtr;
    local_1150 = local_1208;
    cParams_1._0_4_ = local_1270;
    pZStack_1160 = &local_11f8->cParams;
    local_1164 = (local_11f8->cParams).minMatch;
    cParams_1._4_4_ = i;
    local_1120 = matches_00;
    if (anchor < (local_11f8->window).base + local_11f8->nextToUpdate) {
      local_1118 = 0;
    }
    else {
      local_10e8 = local_11f8;
      local_10f0 = anchor;
      local_10f8 = ilimit;
      base_1._0_4_ = (int)optStatePtr;
      _idx = (local_11f8->window).base;
      forward = (int)anchor - (int)_idx;
      base_1._4_4_ = local_1164;
      for (local_1110 = local_11f8->nextToUpdate; pBVar25 = local_ea0, local_1110 < forward;
          local_1110 = local_1114 + local_1110) {
        local_1114 = ZSTD_insertBt1(local_10e8,_idx + local_1110,local_10f8,base_1._4_4_,
                                    (uint)((int)base_1 == 1));
      }
      local_10e8->nextToUpdate = forward;
      local_ea0._0_4_ = (int)local_1138;
      iVar18 = (int)local_ea0;
      local_ea0 = pBVar25;
      switch(local_1164) {
      case 3:
        local_e88 = local_1120;
        local_e90 = local_1128;
        local_e98 = local_1130;
        local_ea0 = local_1138;
        local_ea8 = local_1140;
        local_eac = local_1144;
        local_eb8 = local_1150;
        local_ebc = cParams_1._4_4_;
        local_ec0 = (uint)cParams_1;
        cParams_2._4_4_ = 3;
        pZStack_ed0 = &local_1128->cParams;
        if ((local_1128->cParams).targetLength < 0xfff) {
          local_142c = (local_1128->cParams).targetLength;
        }
        else {
          local_142c = 0xfff;
        }
        base_2._4_4_ = local_142c;
        _hashLog = (local_1128->window).base;
        minMatch_1 = iVar18 - hashLog;
        local_ee8 = (local_1128->cParams).hashLog;
        hashTable._4_4_ = 3;
        h = (size_t)local_1128->hashTable;
        local_e58 = local_1138;
        local_e60 = 3;
        local_e5c = local_ee8;
        sStack_f00 = ZSTD_hash4Ptr(local_1138,local_ee8);
        bt._4_4_ = *(uint *)(h + sStack_f00 * 4);
        _btMask = local_e90->chainTable;
        commonLengthSmaller._4_4_ = pZStack_ed0->chainLog - 1;
        commonLengthSmaller._0_4_ = (1 << ((byte)commonLengthSmaller._4_4_ & 0x1f)) - 1;
        commonLengthLarger = 0;
        dictBase = (BYTE *)0x0;
        pBStack_f30 = (local_e90->window).dictBase;
        dictEnd._4_4_ = (local_e90->window).dictLimit;
        prefixStart_1 = pBStack_f30 + dictEnd._4_4_;
        _windowLow = _hashLog + dictEnd._4_4_;
        if ((uint)commonLengthSmaller < minMatch_1) {
          local_143c = minMatch_1 - (uint)commonLengthSmaller;
        }
        else {
          local_143c = 0;
        }
        matchLow = local_143c;
        local_e50 = sStack_f00;
        local_f50 = ZSTD_getLowestMatchIndex(local_e90,minMatch_1,pZStack_ed0->windowLog);
        local_1440 = local_f50;
        if (local_f50 == 0) {
          local_1440 = 1;
        }
        smallerPtr._4_4_ = local_1440;
        largerPtr = _btMask + ((minMatch_1 & (uint)commonLengthSmaller) << 1);
        _dummy32 = _btMask + (ulong)((minMatch_1 & (uint)commonLengthSmaller) << 1) + 1;
        mnum = minMatch_1 + 9;
        dms._4_4_ = 0;
        dms._0_4_ = 1 << ((byte)pZStack_ed0->searchLog & 0x1f);
        if (local_eac == 2) {
          local_1448 = local_e90->dictMatchState;
        }
        else {
          local_1448 = (ZSTD_matchState_t *)0x0;
        }
        dmsCParams = (ZSTD_compressionParameters *)local_1448;
        if (local_eac == 2) {
          local_1450 = &local_1448->cParams;
        }
        else {
          local_1450 = (ZSTD_compressionParameters *)0x0;
        }
        dmsBase = (BYTE *)local_1450;
        if (local_eac == 2) {
          local_1458 = (local_1448->window).base;
        }
        else {
          local_1458 = (BYTE *)0x0;
        }
        dmsEnd = local_1458;
        if (local_eac == 2) {
          local_1460 = (local_1448->window).nextSrc;
        }
        else {
          local_1460 = (BYTE *)0x0;
        }
        _dmsLowLimit = local_1460;
        if (local_eac == 2) {
          local_1464 = (int)local_1460 - (int)local_1458;
        }
        else {
          local_1464 = 0;
        }
        dmsIndexDelta = local_1464;
        if (local_eac == 2) {
          local_1468 = (local_1448->window).lowLimit;
        }
        else {
          local_1468 = 0;
        }
        dmsHashLog = local_1468;
        if (local_eac == 2) {
          local_146c = local_f50 - local_1464;
        }
        else {
          local_146c = 0;
        }
        dmsBtLog = local_146c;
        if (local_eac == 2) {
          local_1470 = local_1450->hashLog;
        }
        else {
          local_1470 = local_ee8;
        }
        dmsBtMask = local_1470;
        if (local_eac == 2) {
          local_1474 = local_1450->chainLog - 1;
        }
        else {
          local_1474 = commonLengthSmaller._4_4_;
        }
        dmsBtLow = local_1474;
        if (local_eac == 2) {
          local_1478 = (1 << ((byte)local_1474 & 0x1f)) - 1;
        }
        else {
          local_1478 = 0;
        }
        local_fb0 = local_1478;
        if ((local_eac == 2) && (local_1478 < local_1464 - local_1468)) {
          local_147c = local_1464 - local_1478;
        }
        else {
          local_147c = local_1468;
        }
        bestLength._4_4_ = local_147c;
        _repCode = (BYTE *)(ulong)(local_ec0 - 1);
        repOffset = local_ebc + 3;
        for (repIndex = local_ebc; repIndex < repOffset; repIndex = repIndex + 1) {
          if (repIndex == 3) {
            local_1480 = *local_eb8 - 1;
          }
          else {
            local_1480 = local_eb8[repIndex];
          }
          repLen = local_1480;
          local_fd0 = minMatch_1 - local_1480;
          repMatch._4_4_ = 0;
          if (local_1480 - 1 < minMatch_1 - dictEnd._4_4_) {
            bVar29 = local_f50 <= local_fd0;
            UVar19 = ZSTD_readMINMATCH(local_ea0,hashTable._4_4_);
            UVar24 = ZSTD_readMINMATCH(local_ea0 + -(ulong)repLen,hashTable._4_4_);
            if (bVar29 && UVar19 == UVar24) {
              sVar26 = ZSTD_count(local_ea0 + hashTable._4_4_,
                                  local_ea0 + ((ulong)hashTable._4_4_ - (ulong)repLen),local_ea8);
              repMatch._4_4_ = (int)sVar26 + hashTable._4_4_;
            }
          }
          else {
            if (local_eac == 2) {
              local_1490 = dmsEnd + ((ulong)local_fd0 - (ulong)dmsBtLog);
            }
            else {
              local_1490 = pBStack_f30 + local_fd0;
            }
            pBStack_fe0 = local_1490;
            if ((local_eac == 1) &&
               (local_1480 - 1 < minMatch_1 - local_f50 && 2 < (dictEnd._4_4_ - 1) - local_fd0)) {
              UVar19 = ZSTD_readMINMATCH(local_ea0,hashTable._4_4_);
              UVar24 = ZSTD_readMINMATCH(pBStack_fe0,hashTable._4_4_);
              if (UVar19 == UVar24) {
                sVar26 = ZSTD_count_2segments
                                   (local_ea0 + hashTable._4_4_,pBStack_fe0 + hashTable._4_4_,
                                    local_ea8,prefixStart_1,_windowLow);
                repMatch._4_4_ = (int)sVar26 + hashTable._4_4_;
              }
            }
            if ((local_eac == 2) &&
               (repLen - 1 < minMatch_1 - (dmsHashLog + dmsBtLog) &&
                2 < (dictEnd._4_4_ - 1) - local_fd0)) {
              UVar19 = ZSTD_readMINMATCH(local_ea0,hashTable._4_4_);
              UVar24 = ZSTD_readMINMATCH(pBStack_fe0,hashTable._4_4_);
              if (UVar19 == UVar24) {
                sVar26 = ZSTD_count_2segments
                                   (local_ea0 + hashTable._4_4_,pBStack_fe0 + hashTable._4_4_,
                                    local_ea8,_dmsLowLimit,_windowLow);
                repMatch._4_4_ = (int)sVar26 + hashTable._4_4_;
              }
            }
          }
          if (_repCode < (BYTE *)(ulong)repMatch._4_4_) {
            _repCode = (BYTE *)(ulong)repMatch._4_4_;
            local_e88[dms._4_4_].off = repIndex - local_ebc;
            local_e88[dms._4_4_].len = repMatch._4_4_;
            dms._4_4_ = dms._4_4_ + 1;
            UVar19 = dms._4_4_;
            if (base_2._4_4_ < repMatch._4_4_ || local_ea0 + repMatch._4_4_ == local_ea8)
            goto LAB_00cfda19;
          }
        }
        if (((cParams_2._4_4_ == 3) && (_repCode < (BYTE *)0x3)) &&
           (mlen._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_e90,local_e98,local_ea0),
           smallerPtr._4_4_ <= mlen._4_4_ && minMatch_1 - mlen._4_4_ < 0x40000)) {
          if (((local_eac == 0) || (local_eac == 2)) || (dictEnd._4_4_ <= mlen._4_4_)) {
            match_1 = _hashLog + mlen._4_4_;
            match = (BYTE *)ZSTD_count(local_ea0,match_1,local_ea8);
          }
          else {
            nextPtr = (U32 *)(pBStack_f30 + mlen._4_4_);
            match = (BYTE *)ZSTD_count_2segments
                                      (local_ea0,(BYTE *)nextPtr,local_ea8,prefixStart_1,_windowLow)
            ;
          }
          if (match < (BYTE *)(ulong)cParams_2._4_4_) goto LAB_00cfd25d;
          _repCode = match;
          local_e88->off = (minMatch_1 - mlen._4_4_) + 2;
          local_e88->len = (U32)match;
          dms._4_4_ = 1;
          if (match <= (BYTE *)(ulong)base_2._4_4_ && local_ea0 + (long)match != local_ea8)
          goto LAB_00cfd25d;
          local_e90->nextToUpdate = minMatch_1 + 1;
          local_e7c = 1;
          UVar19 = local_e7c;
        }
        else {
LAB_00cfd25d:
          *(U32 *)(h + sStack_f00 * 4) = minMatch_1;
          while (iVar18 = (int)dms + -1, bVar29 = (int)dms != 0, dms._0_4_ = iVar18,
                bVar29 && smallerPtr._4_4_ <= bt._4_4_) {
            match_2 = (BYTE *)(_btMask + ((bt._4_4_ & (uint)commonLengthSmaller) << 1));
            if (commonLengthLarger < dictBase) {
              local_14a8 = (BYTE *)commonLengthLarger;
            }
            else {
              local_14a8 = dictBase;
            }
            dmsH = (size_t)local_14a8;
            if (((local_eac == 0) || (local_eac == 2)) ||
               ((BYTE *)(ulong)dictEnd._4_4_ <= local_14a8 + bt._4_4_)) {
              matchLength = (size_t)(_hashLog + bt._4_4_);
              sVar26 = ZSTD_count(local_ea0 + (long)local_14a8,
                                  (BYTE *)(matchLength + (long)local_14a8),local_ea8);
              dmsH = sVar26 + dmsH;
            }
            else {
              matchLength = (size_t)(pBStack_f30 + bt._4_4_);
              sVar26 = ZSTD_count_2segments
                                 (local_ea0 + (long)local_14a8,
                                  (BYTE *)(matchLength + (long)local_14a8),local_ea8,prefixStart_1,
                                  _windowLow);
              dmsH = sVar26 + dmsH;
              if ((ulong)dictEnd._4_4_ <= bt._4_4_ + dmsH) {
                matchLength = (size_t)(_hashLog + bt._4_4_);
              }
            }
            if (_repCode < dmsH) {
              if (mnum - bt._4_4_ < dmsH) {
                mnum = bt._4_4_ + (U32)dmsH;
              }
              _repCode = (BYTE *)dmsH;
              local_e88[dms._4_4_].off = (minMatch_1 - bt._4_4_) + 2;
              local_e88[dms._4_4_].len = (U32)dmsH;
              dms._4_4_ = dms._4_4_ + 1;
              if (0x1000 < dmsH || local_ea0 + dmsH == local_ea8) {
                if (local_eac == 2) {
                  dms._0_4_ = 0;
                }
                break;
              }
            }
            if (*(byte *)(matchLength + dmsH) < local_ea0[dmsH]) {
              *largerPtr = bt._4_4_;
              commonLengthLarger = dmsH;
              if (bt._4_4_ <= matchLow) {
                largerPtr = &nbCompares;
                break;
              }
              largerPtr = (U32 *)(match_2 + 4);
              bt._4_4_ = *(uint *)(match_2 + 4);
            }
            else {
              *_dummy32 = bt._4_4_;
              dictBase = (BYTE *)dmsH;
              if (bt._4_4_ <= matchLow) {
                _dummy32 = &nbCompares;
                break;
              }
              _dummy32 = (U32 *)match_2;
              bt._4_4_ = *(uint *)match_2;
            }
          }
          *_dummy32 = 0;
          *largerPtr = 0;
          if ((local_eac == 2) && ((int)dms != 0)) {
            local_e70 = local_ea0;
            local_e74 = dmsBtMask;
            local_e78 = cParams_2._4_4_;
            switch(cParams_2._4_4_) {
            default:
              local_e68 = ZSTD_hash4Ptr(local_ea0,dmsBtMask);
              break;
            case 5:
              local_e68 = ZSTD_hash5Ptr(local_ea0,dmsBtMask);
              break;
            case 6:
              local_e68 = ZSTD_hash6Ptr(local_ea0,dmsBtMask);
              break;
            case 7:
              local_e68 = ZSTD_hash7Ptr(local_ea0,dmsBtMask);
              break;
            case 8:
              local_e68 = ZSTD_hash8Ptr(local_ea0,dmsBtMask);
            }
            sStack_1020 = local_e68;
            dmsBt._4_4_ = *(uint *)(*(long *)&dmsCParams[3].searchLog + local_e68 * 4);
            nextPtr_1 = *(U32 **)(dmsCParams + 4);
            dictBase = (BYTE *)0x0;
            commonLengthLarger = 0;
            while (iVar18 = (int)dms + -1, bVar29 = (int)dms != 0, dms._0_4_ = iVar18,
                  bVar29 && dmsHashLog < dmsBt._4_4_) {
              matchLength_1 = (size_t)(nextPtr_1 + ((dmsBt._4_4_ & local_fb0) << 1));
              if (commonLengthLarger < dictBase) {
                local_14c0 = (BYTE *)commonLengthLarger;
              }
              else {
                local_14c0 = dictBase;
              }
              match_3 = local_14c0;
              local_1048 = dmsEnd + dmsBt._4_4_;
              sVar26 = ZSTD_count_2segments
                                 (local_ea0 + (long)local_14c0,local_1048 + (long)local_14c0,
                                  local_ea8,_dmsLowLimit,_windowLow);
              match_3 = match_3 + sVar26;
              if ((BYTE *)(ulong)dmsIndexDelta <= match_3 + dmsBt._4_4_) {
                local_1048 = _hashLog + (ulong)dmsBtLog + (ulong)dmsBt._4_4_;
              }
              if (_repCode < match_3) {
                bt._4_4_ = dmsBt._4_4_ + dmsBtLog;
                if ((BYTE *)(ulong)(mnum - bt._4_4_) < match_3) {
                  mnum = bt._4_4_ + (U32)match_3;
                }
                local_e88[dms._4_4_].off = (minMatch_1 - bt._4_4_) + 2;
                local_e88[dms._4_4_].len = (U32)match_3;
                dms._4_4_ = dms._4_4_ + 1;
                _repCode = match_3;
                if ((BYTE *)0x1000 < match_3 || local_ea0 + (long)match_3 == local_ea8) break;
              }
              if (dmsBt._4_4_ <= bestLength._4_4_) break;
              if (local_1048[(long)match_3] < local_ea0[(long)match_3]) {
                dmsBt._4_4_ = *(uint *)(matchLength_1 + 4);
                commonLengthLarger = (size_t)match_3;
              }
              else {
                dmsBt._4_4_ = *(uint *)matchLength_1;
                dictBase = match_3;
              }
            }
          }
          local_e90->nextToUpdate = mnum - 8;
          local_e7c = dms._4_4_;
          UVar19 = local_e7c;
        }
LAB_00cfda19:
        local_e7c = UVar19;
        local_1118 = local_e7c;
        dms._4_4_ = local_e7c;
        break;
      default:
        local_c88 = local_1120;
        local_c90 = local_1128;
        local_c98 = local_1130;
        local_ca0 = local_1138;
        local_ca8 = local_1140;
        local_cac = local_1144;
        local_cb8 = local_1150;
        local_cbc = cParams_1._4_4_;
        local_cc0 = (uint)cParams_1;
        cParams_3._4_4_ = 4;
        pZStack_cd0 = &local_1128->cParams;
        if ((local_1128->cParams).targetLength < 0xfff) {
          local_14c4 = (local_1128->cParams).targetLength;
        }
        else {
          local_14c4 = 0xfff;
        }
        base_3._4_4_ = local_14c4;
        _hashLog_1 = (local_1128->window).base;
        minMatch_2 = (int)local_ea0 - hashLog_1;
        local_ce8 = (local_1128->cParams).hashLog;
        hashTable_1._4_4_ = 4;
        h_1 = (size_t)local_1128->hashTable;
        local_c58 = local_1138;
        local_c60 = 4;
        local_c5c = local_ce8;
        sStack_d00 = ZSTD_hash4Ptr(local_1138,local_ce8);
        bt_1._4_4_ = *(uint *)(h_1 + sStack_d00 * 4);
        _btMask_1 = local_c90->chainTable;
        commonLengthSmaller_1._4_4_ = pZStack_cd0->chainLog - 1;
        commonLengthSmaller_1._0_4_ = (1 << ((byte)commonLengthSmaller_1._4_4_ & 0x1f)) - 1;
        commonLengthLarger_1 = 0;
        dictBase_1 = (BYTE *)0x0;
        pBStack_d30 = (local_c90->window).dictBase;
        dictEnd_1._4_4_ = (local_c90->window).dictLimit;
        prefixStart_2 = pBStack_d30 + dictEnd_1._4_4_;
        _windowLow_1 = _hashLog_1 + dictEnd_1._4_4_;
        if ((uint)commonLengthSmaller_1 < minMatch_2) {
          local_14d4 = minMatch_2 - (uint)commonLengthSmaller_1;
        }
        else {
          local_14d4 = 0;
        }
        matchLow_1 = local_14d4;
        local_c50 = sStack_d00;
        local_d50 = ZSTD_getLowestMatchIndex(local_c90,minMatch_2,pZStack_cd0->windowLog);
        local_14d8 = local_d50;
        if (local_d50 == 0) {
          local_14d8 = 1;
        }
        smallerPtr_1._4_4_ = local_14d8;
        largerPtr_1 = _btMask_1 + ((minMatch_2 & (uint)commonLengthSmaller_1) << 1);
        _dummy32_1 = _btMask_1 + (ulong)((minMatch_2 & (uint)commonLengthSmaller_1) << 1) + 1;
        mnum_1 = minMatch_2 + 9;
        dms_1._4_4_ = 0;
        dms_1._0_4_ = 1 << ((byte)pZStack_cd0->searchLog & 0x1f);
        if (local_cac == 2) {
          local_14e0 = local_c90->dictMatchState;
        }
        else {
          local_14e0 = (ZSTD_matchState_t *)0x0;
        }
        dmsCParams_1 = (ZSTD_compressionParameters *)local_14e0;
        if (local_cac == 2) {
          local_14e8 = &local_14e0->cParams;
        }
        else {
          local_14e8 = (ZSTD_compressionParameters *)0x0;
        }
        dmsBase_1 = (BYTE *)local_14e8;
        if (local_cac == 2) {
          local_14f0 = (local_14e0->window).base;
        }
        else {
          local_14f0 = (BYTE *)0x0;
        }
        dmsEnd_1 = local_14f0;
        if (local_cac == 2) {
          local_14f8 = (local_14e0->window).nextSrc;
        }
        else {
          local_14f8 = (BYTE *)0x0;
        }
        _dmsLowLimit_1 = local_14f8;
        if (local_cac == 2) {
          local_14fc = (int)local_14f8 - (int)local_14f0;
        }
        else {
          local_14fc = 0;
        }
        dmsIndexDelta_1 = local_14fc;
        if (local_cac == 2) {
          local_1500 = (local_14e0->window).lowLimit;
        }
        else {
          local_1500 = 0;
        }
        dmsHashLog_1 = local_1500;
        if (local_cac == 2) {
          local_1504 = local_d50 - local_14fc;
        }
        else {
          local_1504 = 0;
        }
        dmsBtLog_1 = local_1504;
        if (local_cac == 2) {
          local_1508 = local_14e8->hashLog;
        }
        else {
          local_1508 = local_ce8;
        }
        dmsBtMask_1 = local_1508;
        if (local_cac == 2) {
          local_150c = local_14e8->chainLog - 1;
        }
        else {
          local_150c = commonLengthSmaller_1._4_4_;
        }
        dmsBtLow_1 = local_150c;
        if (local_cac == 2) {
          local_1510 = (1 << ((byte)local_150c & 0x1f)) - 1;
        }
        else {
          local_1510 = 0;
        }
        local_db0 = local_1510;
        if ((local_cac == 2) && (local_1510 < local_14fc - local_1500)) {
          local_1514 = local_14fc - local_1510;
        }
        else {
          local_1514 = local_1500;
        }
        bestLength_1._4_4_ = local_1514;
        _repCode_1 = (BYTE *)(ulong)(local_cc0 - 1);
        repOffset_1 = local_cbc + 3;
        for (repIndex_1 = local_cbc; repIndex_1 < repOffset_1; repIndex_1 = repIndex_1 + 1) {
          if (repIndex_1 == 3) {
            local_1518 = *local_cb8 - 1;
          }
          else {
            local_1518 = local_cb8[repIndex_1];
          }
          repLen_1 = local_1518;
          local_dd0 = minMatch_2 - local_1518;
          repMatch_1._4_4_ = 0;
          if (local_1518 - 1 < minMatch_2 - dictEnd_1._4_4_) {
            bVar29 = local_d50 <= local_dd0;
            UVar19 = ZSTD_readMINMATCH(local_ca0,hashTable_1._4_4_);
            UVar24 = ZSTD_readMINMATCH(local_ca0 + -(ulong)repLen_1,hashTable_1._4_4_);
            if (bVar29 && UVar19 == UVar24) {
              sVar26 = ZSTD_count(local_ca0 + hashTable_1._4_4_,
                                  local_ca0 + ((ulong)hashTable_1._4_4_ - (ulong)repLen_1),local_ca8
                                 );
              repMatch_1._4_4_ = (int)sVar26 + hashTable_1._4_4_;
            }
          }
          else {
            if (local_cac == 2) {
              local_1528 = dmsEnd_1 + ((ulong)local_dd0 - (ulong)dmsBtLog_1);
            }
            else {
              local_1528 = pBStack_d30 + local_dd0;
            }
            pBStack_de0 = local_1528;
            if ((local_cac == 1) &&
               (local_1518 - 1 < minMatch_2 - local_d50 && 2 < (dictEnd_1._4_4_ - 1) - local_dd0)) {
              UVar19 = ZSTD_readMINMATCH(local_ca0,hashTable_1._4_4_);
              UVar24 = ZSTD_readMINMATCH(pBStack_de0,hashTable_1._4_4_);
              if (UVar19 == UVar24) {
                sVar26 = ZSTD_count_2segments
                                   (local_ca0 + hashTable_1._4_4_,pBStack_de0 + hashTable_1._4_4_,
                                    local_ca8,prefixStart_2,_windowLow_1);
                repMatch_1._4_4_ = (int)sVar26 + hashTable_1._4_4_;
              }
            }
            if ((local_cac == 2) &&
               (repLen_1 - 1 < minMatch_2 - (dmsHashLog_1 + dmsBtLog_1) &&
                2 < (dictEnd_1._4_4_ - 1) - local_dd0)) {
              UVar19 = ZSTD_readMINMATCH(local_ca0,hashTable_1._4_4_);
              UVar24 = ZSTD_readMINMATCH(pBStack_de0,hashTable_1._4_4_);
              if (UVar19 == UVar24) {
                sVar26 = ZSTD_count_2segments
                                   (local_ca0 + hashTable_1._4_4_,pBStack_de0 + hashTable_1._4_4_,
                                    local_ca8,_dmsLowLimit_1,_windowLow_1);
                repMatch_1._4_4_ = (int)sVar26 + hashTable_1._4_4_;
              }
            }
          }
          if (_repCode_1 < (BYTE *)(ulong)repMatch_1._4_4_) {
            _repCode_1 = (BYTE *)(ulong)repMatch_1._4_4_;
            local_c88[dms_1._4_4_].off = repIndex_1 - local_cbc;
            local_c88[dms_1._4_4_].len = repMatch_1._4_4_;
            dms_1._4_4_ = dms_1._4_4_ + 1;
            UVar19 = dms_1._4_4_;
            if (base_3._4_4_ < repMatch_1._4_4_ || local_ca0 + repMatch_1._4_4_ == local_ca8)
            goto LAB_00cfee31;
          }
        }
        if (((cParams_3._4_4_ == 3) && (_repCode_1 < (BYTE *)0x3)) &&
           (mlen_1._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_c90,local_c98,local_ca0),
           smallerPtr_1._4_4_ <= mlen_1._4_4_ && minMatch_2 - mlen_1._4_4_ < 0x40000)) {
          if (((local_cac == 0) || (local_cac == 2)) || (dictEnd_1._4_4_ <= mlen_1._4_4_)) {
            match_5 = _hashLog_1 + mlen_1._4_4_;
            match_4 = (BYTE *)ZSTD_count(local_ca0,match_5,local_ca8);
          }
          else {
            nextPtr_2 = (U32 *)(pBStack_d30 + mlen_1._4_4_);
            match_4 = (BYTE *)ZSTD_count_2segments
                                        (local_ca0,(BYTE *)nextPtr_2,local_ca8,prefixStart_2,
                                         _windowLow_1);
          }
          if (match_4 < (BYTE *)(ulong)cParams_3._4_4_) goto LAB_00cfe675;
          _repCode_1 = match_4;
          local_c88->off = (minMatch_2 - mlen_1._4_4_) + 2;
          local_c88->len = (U32)match_4;
          dms_1._4_4_ = 1;
          if (match_4 <= (BYTE *)(ulong)base_3._4_4_ && local_ca0 + (long)match_4 != local_ca8)
          goto LAB_00cfe675;
          local_c90->nextToUpdate = minMatch_2 + 1;
          local_c7c = 1;
          UVar19 = local_c7c;
        }
        else {
LAB_00cfe675:
          *(U32 *)(h_1 + sStack_d00 * 4) = minMatch_2;
          while (iVar18 = (int)dms_1 + -1, bVar29 = (int)dms_1 != 0, dms_1._0_4_ = iVar18,
                bVar29 && smallerPtr_1._4_4_ <= bt_1._4_4_) {
            match_6 = (BYTE *)(_btMask_1 + ((bt_1._4_4_ & (uint)commonLengthSmaller_1) << 1));
            if (commonLengthLarger_1 < dictBase_1) {
              local_1540 = (BYTE *)commonLengthLarger_1;
            }
            else {
              local_1540 = dictBase_1;
            }
            dmsH_1 = (size_t)local_1540;
            if (((local_cac == 0) || (local_cac == 2)) ||
               ((BYTE *)(ulong)dictEnd_1._4_4_ <= local_1540 + bt_1._4_4_)) {
              matchLength_2 = (size_t)(_hashLog_1 + bt_1._4_4_);
              sVar26 = ZSTD_count(local_ca0 + (long)local_1540,
                                  (BYTE *)(matchLength_2 + (long)local_1540),local_ca8);
              dmsH_1 = sVar26 + dmsH_1;
            }
            else {
              matchLength_2 = (size_t)(pBStack_d30 + bt_1._4_4_);
              sVar26 = ZSTD_count_2segments
                                 (local_ca0 + (long)local_1540,
                                  (BYTE *)(matchLength_2 + (long)local_1540),local_ca8,prefixStart_2
                                  ,_windowLow_1);
              dmsH_1 = sVar26 + dmsH_1;
              if ((ulong)dictEnd_1._4_4_ <= bt_1._4_4_ + dmsH_1) {
                matchLength_2 = (size_t)(_hashLog_1 + bt_1._4_4_);
              }
            }
            if (_repCode_1 < dmsH_1) {
              if (mnum_1 - bt_1._4_4_ < dmsH_1) {
                mnum_1 = bt_1._4_4_ + (U32)dmsH_1;
              }
              _repCode_1 = (BYTE *)dmsH_1;
              local_c88[dms_1._4_4_].off = (minMatch_2 - bt_1._4_4_) + 2;
              local_c88[dms_1._4_4_].len = (U32)dmsH_1;
              dms_1._4_4_ = dms_1._4_4_ + 1;
              if (0x1000 < dmsH_1 || local_ca0 + dmsH_1 == local_ca8) {
                if (local_cac == 2) {
                  dms_1._0_4_ = 0;
                }
                break;
              }
            }
            if (*(byte *)(matchLength_2 + dmsH_1) < local_ca0[dmsH_1]) {
              *largerPtr_1 = bt_1._4_4_;
              commonLengthLarger_1 = dmsH_1;
              if (bt_1._4_4_ <= matchLow_1) {
                largerPtr_1 = &nbCompares_1;
                break;
              }
              largerPtr_1 = (U32 *)(match_6 + 4);
              bt_1._4_4_ = *(uint *)(match_6 + 4);
            }
            else {
              *_dummy32_1 = bt_1._4_4_;
              dictBase_1 = (BYTE *)dmsH_1;
              if (bt_1._4_4_ <= matchLow_1) {
                _dummy32_1 = &nbCompares_1;
                break;
              }
              _dummy32_1 = (U32 *)match_6;
              bt_1._4_4_ = *(uint *)match_6;
            }
          }
          *_dummy32_1 = 0;
          *largerPtr_1 = 0;
          if ((local_cac == 2) && ((int)dms_1 != 0)) {
            local_c70 = local_ca0;
            local_c74 = dmsBtMask_1;
            local_c78 = cParams_3._4_4_;
            switch(cParams_3._4_4_) {
            default:
              local_c68 = ZSTD_hash4Ptr(local_ca0,dmsBtMask_1);
              break;
            case 5:
              local_c68 = ZSTD_hash5Ptr(local_ca0,dmsBtMask_1);
              break;
            case 6:
              local_c68 = ZSTD_hash6Ptr(local_ca0,dmsBtMask_1);
              break;
            case 7:
              local_c68 = ZSTD_hash7Ptr(local_ca0,dmsBtMask_1);
              break;
            case 8:
              local_c68 = ZSTD_hash8Ptr(local_ca0,dmsBtMask_1);
            }
            sStack_e20 = local_c68;
            dmsBt_1._4_4_ = *(uint *)(*(long *)&dmsCParams_1[3].searchLog + local_c68 * 4);
            nextPtr_3 = *(U32 **)(dmsCParams_1 + 4);
            dictBase_1 = (BYTE *)0x0;
            commonLengthLarger_1 = 0;
            while (iVar18 = (int)dms_1 + -1, bVar29 = (int)dms_1 != 0, dms_1._0_4_ = iVar18,
                  bVar29 && dmsHashLog_1 < dmsBt_1._4_4_) {
              matchLength_3 = (size_t)(nextPtr_3 + ((dmsBt_1._4_4_ & local_db0) << 1));
              if (commonLengthLarger_1 < dictBase_1) {
                local_1558 = (BYTE *)commonLengthLarger_1;
              }
              else {
                local_1558 = dictBase_1;
              }
              match_7 = local_1558;
              local_e48 = dmsEnd_1 + dmsBt_1._4_4_;
              sVar26 = ZSTD_count_2segments
                                 (local_ca0 + (long)local_1558,local_e48 + (long)local_1558,
                                  local_ca8,_dmsLowLimit_1,_windowLow_1);
              match_7 = match_7 + sVar26;
              if ((BYTE *)(ulong)dmsIndexDelta_1 <= match_7 + dmsBt_1._4_4_) {
                local_e48 = _hashLog_1 + (ulong)dmsBtLog_1 + (ulong)dmsBt_1._4_4_;
              }
              if (_repCode_1 < match_7) {
                bt_1._4_4_ = dmsBt_1._4_4_ + dmsBtLog_1;
                if ((BYTE *)(ulong)(mnum_1 - bt_1._4_4_) < match_7) {
                  mnum_1 = bt_1._4_4_ + (U32)match_7;
                }
                local_c88[dms_1._4_4_].off = (minMatch_2 - bt_1._4_4_) + 2;
                local_c88[dms_1._4_4_].len = (U32)match_7;
                dms_1._4_4_ = dms_1._4_4_ + 1;
                _repCode_1 = match_7;
                if ((BYTE *)0x1000 < match_7 || local_ca0 + (long)match_7 == local_ca8) break;
              }
              if (dmsBt_1._4_4_ <= bestLength_1._4_4_) break;
              if (local_e48[(long)match_7] < local_ca0[(long)match_7]) {
                dmsBt_1._4_4_ = *(uint *)(matchLength_3 + 4);
                commonLengthLarger_1 = (size_t)match_7;
              }
              else {
                dmsBt_1._4_4_ = *(uint *)matchLength_3;
                dictBase_1 = match_7;
              }
            }
          }
          local_c90->nextToUpdate = mnum_1 - 8;
          local_c7c = dms_1._4_4_;
          UVar19 = local_c7c;
        }
LAB_00cfee31:
        local_c7c = UVar19;
        local_1118 = local_c7c;
        dms_1._4_4_ = local_c7c;
        break;
      case 5:
        local_a88 = local_1120;
        local_a90 = local_1128;
        local_a98 = local_1130;
        local_aa0 = local_1138;
        local_aa8 = local_1140;
        local_aac = local_1144;
        local_ab8 = local_1150;
        local_abc = cParams_1._4_4_;
        local_ac0 = (uint)cParams_1;
        cParams_4._4_4_ = 5;
        pZStack_ad0 = &local_1128->cParams;
        if ((local_1128->cParams).targetLength < 0xfff) {
          local_155c = (local_1128->cParams).targetLength;
        }
        else {
          local_155c = 0xfff;
        }
        base_4._4_4_ = local_155c;
        _hashLog_2 = (local_1128->window).base;
        minMatch_3 = (int)local_ea0 - hashLog_2;
        local_ae8 = (local_1128->cParams).hashLog;
        hashTable_2._4_4_ = 4;
        h_2 = (size_t)local_1128->hashTable;
        local_a58 = local_1138;
        local_a60 = 5;
        local_a5c = local_ae8;
        sStack_b00 = ZSTD_hash5Ptr(local_1138,local_ae8);
        bt_2._4_4_ = *(uint *)(h_2 + sStack_b00 * 4);
        _btMask_2 = local_a90->chainTable;
        commonLengthSmaller_2._4_4_ = pZStack_ad0->chainLog - 1;
        commonLengthSmaller_2._0_4_ = (1 << ((byte)commonLengthSmaller_2._4_4_ & 0x1f)) - 1;
        commonLengthLarger_2 = 0;
        dictBase_2 = (BYTE *)0x0;
        pBStack_b30 = (local_a90->window).dictBase;
        dictEnd_2._4_4_ = (local_a90->window).dictLimit;
        prefixStart_3 = pBStack_b30 + dictEnd_2._4_4_;
        _windowLow_2 = _hashLog_2 + dictEnd_2._4_4_;
        if ((uint)commonLengthSmaller_2 < minMatch_3) {
          local_156c = minMatch_3 - (uint)commonLengthSmaller_2;
        }
        else {
          local_156c = 0;
        }
        matchLow_2 = local_156c;
        local_a50 = sStack_b00;
        local_b50 = ZSTD_getLowestMatchIndex(local_a90,minMatch_3,pZStack_ad0->windowLog);
        local_1570 = local_b50;
        if (local_b50 == 0) {
          local_1570 = 1;
        }
        smallerPtr_2._4_4_ = local_1570;
        largerPtr_2 = _btMask_2 + ((minMatch_3 & (uint)commonLengthSmaller_2) << 1);
        _dummy32_2 = _btMask_2 + (ulong)((minMatch_3 & (uint)commonLengthSmaller_2) << 1) + 1;
        mnum_2 = minMatch_3 + 9;
        dms_2._4_4_ = 0;
        dms_2._0_4_ = 1 << ((byte)pZStack_ad0->searchLog & 0x1f);
        if (local_aac == 2) {
          local_1578 = local_a90->dictMatchState;
        }
        else {
          local_1578 = (ZSTD_matchState_t *)0x0;
        }
        dmsCParams_2 = (ZSTD_compressionParameters *)local_1578;
        if (local_aac == 2) {
          local_1580 = &local_1578->cParams;
        }
        else {
          local_1580 = (ZSTD_compressionParameters *)0x0;
        }
        dmsBase_2 = (BYTE *)local_1580;
        if (local_aac == 2) {
          local_1588 = (local_1578->window).base;
        }
        else {
          local_1588 = (BYTE *)0x0;
        }
        dmsEnd_2 = local_1588;
        if (local_aac == 2) {
          local_1590 = (local_1578->window).nextSrc;
        }
        else {
          local_1590 = (BYTE *)0x0;
        }
        _dmsLowLimit_2 = local_1590;
        if (local_aac == 2) {
          local_1594 = (int)local_1590 - (int)local_1588;
        }
        else {
          local_1594 = 0;
        }
        dmsIndexDelta_2 = local_1594;
        if (local_aac == 2) {
          local_1598 = (local_1578->window).lowLimit;
        }
        else {
          local_1598 = 0;
        }
        dmsHashLog_2 = local_1598;
        if (local_aac == 2) {
          local_159c = local_b50 - local_1594;
        }
        else {
          local_159c = 0;
        }
        dmsBtLog_2 = local_159c;
        if (local_aac == 2) {
          local_15a0 = local_1580->hashLog;
        }
        else {
          local_15a0 = local_ae8;
        }
        dmsBtMask_2 = local_15a0;
        if (local_aac == 2) {
          local_15a4 = local_1580->chainLog - 1;
        }
        else {
          local_15a4 = commonLengthSmaller_2._4_4_;
        }
        dmsBtLow_2 = local_15a4;
        if (local_aac == 2) {
          local_15a8 = (1 << ((byte)local_15a4 & 0x1f)) - 1;
        }
        else {
          local_15a8 = 0;
        }
        local_bb0 = local_15a8;
        if ((local_aac == 2) && (local_15a8 < local_1594 - local_1598)) {
          local_15ac = local_1594 - local_15a8;
        }
        else {
          local_15ac = local_1598;
        }
        bestLength_2._4_4_ = local_15ac;
        _repCode_2 = (BYTE *)(ulong)(local_ac0 - 1);
        repOffset_2 = local_abc + 3;
        for (repIndex_2 = local_abc; repIndex_2 < repOffset_2; repIndex_2 = repIndex_2 + 1) {
          if (repIndex_2 == 3) {
            local_15b0 = *local_ab8 - 1;
          }
          else {
            local_15b0 = local_ab8[repIndex_2];
          }
          repLen_2 = local_15b0;
          local_bd0 = minMatch_3 - local_15b0;
          repMatch_2._4_4_ = 0;
          if (local_15b0 - 1 < minMatch_3 - dictEnd_2._4_4_) {
            bVar29 = local_b50 <= local_bd0;
            UVar19 = ZSTD_readMINMATCH(local_aa0,hashTable_2._4_4_);
            UVar24 = ZSTD_readMINMATCH(local_aa0 + -(ulong)repLen_2,hashTable_2._4_4_);
            if (bVar29 && UVar19 == UVar24) {
              sVar26 = ZSTD_count(local_aa0 + hashTable_2._4_4_,
                                  local_aa0 + ((ulong)hashTable_2._4_4_ - (ulong)repLen_2),local_aa8
                                 );
              repMatch_2._4_4_ = (int)sVar26 + hashTable_2._4_4_;
            }
          }
          else {
            if (local_aac == 2) {
              local_15c0 = dmsEnd_2 + ((ulong)local_bd0 - (ulong)dmsBtLog_2);
            }
            else {
              local_15c0 = pBStack_b30 + local_bd0;
            }
            pBStack_be0 = local_15c0;
            if ((local_aac == 1) &&
               (local_15b0 - 1 < minMatch_3 - local_b50 && 2 < (dictEnd_2._4_4_ - 1) - local_bd0)) {
              UVar19 = ZSTD_readMINMATCH(local_aa0,hashTable_2._4_4_);
              UVar24 = ZSTD_readMINMATCH(pBStack_be0,hashTable_2._4_4_);
              if (UVar19 == UVar24) {
                sVar26 = ZSTD_count_2segments
                                   (local_aa0 + hashTable_2._4_4_,pBStack_be0 + hashTable_2._4_4_,
                                    local_aa8,prefixStart_3,_windowLow_2);
                repMatch_2._4_4_ = (int)sVar26 + hashTable_2._4_4_;
              }
            }
            if ((local_aac == 2) &&
               (repLen_2 - 1 < minMatch_3 - (dmsHashLog_2 + dmsBtLog_2) &&
                2 < (dictEnd_2._4_4_ - 1) - local_bd0)) {
              UVar19 = ZSTD_readMINMATCH(local_aa0,hashTable_2._4_4_);
              UVar24 = ZSTD_readMINMATCH(pBStack_be0,hashTable_2._4_4_);
              if (UVar19 == UVar24) {
                sVar26 = ZSTD_count_2segments
                                   (local_aa0 + hashTable_2._4_4_,pBStack_be0 + hashTable_2._4_4_,
                                    local_aa8,_dmsLowLimit_2,_windowLow_2);
                repMatch_2._4_4_ = (int)sVar26 + hashTable_2._4_4_;
              }
            }
          }
          if (_repCode_2 < (BYTE *)(ulong)repMatch_2._4_4_) {
            _repCode_2 = (BYTE *)(ulong)repMatch_2._4_4_;
            local_a88[dms_2._4_4_].off = repIndex_2 - local_abc;
            local_a88[dms_2._4_4_].len = repMatch_2._4_4_;
            dms_2._4_4_ = dms_2._4_4_ + 1;
            UVar19 = dms_2._4_4_;
            if (base_4._4_4_ < repMatch_2._4_4_ || local_aa0 + repMatch_2._4_4_ == local_aa8)
            goto LAB_00d00247;
          }
        }
        if (((cParams_4._4_4_ == 3) && (_repCode_2 < (BYTE *)0x3)) &&
           (mlen_2._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_a90,local_a98,local_aa0),
           smallerPtr_2._4_4_ <= mlen_2._4_4_ && minMatch_3 - mlen_2._4_4_ < 0x40000)) {
          if (((local_aac == 0) || (local_aac == 2)) || (dictEnd_2._4_4_ <= mlen_2._4_4_)) {
            match_9 = _hashLog_2 + mlen_2._4_4_;
            match_8 = (BYTE *)ZSTD_count(local_aa0,match_9,local_aa8);
          }
          else {
            nextPtr_4 = (U32 *)(pBStack_b30 + mlen_2._4_4_);
            match_8 = (BYTE *)ZSTD_count_2segments
                                        (local_aa0,(BYTE *)nextPtr_4,local_aa8,prefixStart_3,
                                         _windowLow_2);
          }
          if (match_8 < (BYTE *)(ulong)cParams_4._4_4_) goto LAB_00cffa8b;
          _repCode_2 = match_8;
          local_a88->off = (minMatch_3 - mlen_2._4_4_) + 2;
          local_a88->len = (U32)match_8;
          dms_2._4_4_ = 1;
          if (match_8 <= (BYTE *)(ulong)base_4._4_4_ && local_aa0 + (long)match_8 != local_aa8)
          goto LAB_00cffa8b;
          local_a90->nextToUpdate = minMatch_3 + 1;
          local_a7c = 1;
          UVar19 = local_a7c;
        }
        else {
LAB_00cffa8b:
          *(U32 *)(h_2 + sStack_b00 * 4) = minMatch_3;
          while (iVar18 = (int)dms_2 + -1, bVar29 = (int)dms_2 != 0, dms_2._0_4_ = iVar18,
                bVar29 && smallerPtr_2._4_4_ <= bt_2._4_4_) {
            match_10 = (BYTE *)(_btMask_2 + ((bt_2._4_4_ & (uint)commonLengthSmaller_2) << 1));
            if (commonLengthLarger_2 < dictBase_2) {
              local_15d8 = (BYTE *)commonLengthLarger_2;
            }
            else {
              local_15d8 = dictBase_2;
            }
            dmsH_2 = (size_t)local_15d8;
            if (((local_aac == 0) || (local_aac == 2)) ||
               ((BYTE *)(ulong)dictEnd_2._4_4_ <= local_15d8 + bt_2._4_4_)) {
              matchLength_4 = (size_t)(_hashLog_2 + bt_2._4_4_);
              sVar26 = ZSTD_count(local_aa0 + (long)local_15d8,
                                  (BYTE *)(matchLength_4 + (long)local_15d8),local_aa8);
              dmsH_2 = sVar26 + dmsH_2;
            }
            else {
              matchLength_4 = (size_t)(pBStack_b30 + bt_2._4_4_);
              sVar26 = ZSTD_count_2segments
                                 (local_aa0 + (long)local_15d8,
                                  (BYTE *)(matchLength_4 + (long)local_15d8),local_aa8,prefixStart_3
                                  ,_windowLow_2);
              dmsH_2 = sVar26 + dmsH_2;
              if ((ulong)dictEnd_2._4_4_ <= bt_2._4_4_ + dmsH_2) {
                matchLength_4 = (size_t)(_hashLog_2 + bt_2._4_4_);
              }
            }
            if (_repCode_2 < dmsH_2) {
              if (mnum_2 - bt_2._4_4_ < dmsH_2) {
                mnum_2 = bt_2._4_4_ + (U32)dmsH_2;
              }
              _repCode_2 = (BYTE *)dmsH_2;
              local_a88[dms_2._4_4_].off = (minMatch_3 - bt_2._4_4_) + 2;
              local_a88[dms_2._4_4_].len = (U32)dmsH_2;
              dms_2._4_4_ = dms_2._4_4_ + 1;
              if (0x1000 < dmsH_2 || local_aa0 + dmsH_2 == local_aa8) {
                if (local_aac == 2) {
                  dms_2._0_4_ = 0;
                }
                break;
              }
            }
            if (*(byte *)(matchLength_4 + dmsH_2) < local_aa0[dmsH_2]) {
              *largerPtr_2 = bt_2._4_4_;
              commonLengthLarger_2 = dmsH_2;
              if (bt_2._4_4_ <= matchLow_2) {
                largerPtr_2 = &nbCompares_2;
                break;
              }
              largerPtr_2 = (U32 *)(match_10 + 4);
              bt_2._4_4_ = *(uint *)(match_10 + 4);
            }
            else {
              *_dummy32_2 = bt_2._4_4_;
              dictBase_2 = (BYTE *)dmsH_2;
              if (bt_2._4_4_ <= matchLow_2) {
                _dummy32_2 = &nbCompares_2;
                break;
              }
              _dummy32_2 = (U32 *)match_10;
              bt_2._4_4_ = *(uint *)match_10;
            }
          }
          *_dummy32_2 = 0;
          *largerPtr_2 = 0;
          if ((local_aac == 2) && ((int)dms_2 != 0)) {
            local_a70 = local_aa0;
            local_a74 = dmsBtMask_2;
            local_a78 = cParams_4._4_4_;
            switch(cParams_4._4_4_) {
            default:
              local_a68 = ZSTD_hash4Ptr(local_aa0,dmsBtMask_2);
              break;
            case 5:
              local_a68 = ZSTD_hash5Ptr(local_aa0,dmsBtMask_2);
              break;
            case 6:
              local_a68 = ZSTD_hash6Ptr(local_aa0,dmsBtMask_2);
              break;
            case 7:
              local_a68 = ZSTD_hash7Ptr(local_aa0,dmsBtMask_2);
              break;
            case 8:
              local_a68 = ZSTD_hash8Ptr(local_aa0,dmsBtMask_2);
            }
            sStack_c20 = local_a68;
            dmsBt_2._4_4_ = *(uint *)(*(long *)&dmsCParams_2[3].searchLog + local_a68 * 4);
            nextPtr_5 = *(U32 **)(dmsCParams_2 + 4);
            dictBase_2 = (BYTE *)0x0;
            commonLengthLarger_2 = 0;
            while (iVar18 = (int)dms_2 + -1, bVar29 = (int)dms_2 != 0, dms_2._0_4_ = iVar18,
                  bVar29 && dmsHashLog_2 < dmsBt_2._4_4_) {
              matchLength_5 = (size_t)(nextPtr_5 + ((dmsBt_2._4_4_ & local_bb0) << 1));
              if (commonLengthLarger_2 < dictBase_2) {
                local_15f0 = (BYTE *)commonLengthLarger_2;
              }
              else {
                local_15f0 = dictBase_2;
              }
              match_11 = local_15f0;
              local_c48 = dmsEnd_2 + dmsBt_2._4_4_;
              sVar26 = ZSTD_count_2segments
                                 (local_aa0 + (long)local_15f0,local_c48 + (long)local_15f0,
                                  local_aa8,_dmsLowLimit_2,_windowLow_2);
              match_11 = match_11 + sVar26;
              if ((BYTE *)(ulong)dmsIndexDelta_2 <= match_11 + dmsBt_2._4_4_) {
                local_c48 = _hashLog_2 + (ulong)dmsBtLog_2 + (ulong)dmsBt_2._4_4_;
              }
              if (_repCode_2 < match_11) {
                bt_2._4_4_ = dmsBt_2._4_4_ + dmsBtLog_2;
                if ((BYTE *)(ulong)(mnum_2 - bt_2._4_4_) < match_11) {
                  mnum_2 = bt_2._4_4_ + (U32)match_11;
                }
                local_a88[dms_2._4_4_].off = (minMatch_3 - bt_2._4_4_) + 2;
                local_a88[dms_2._4_4_].len = (U32)match_11;
                dms_2._4_4_ = dms_2._4_4_ + 1;
                _repCode_2 = match_11;
                if ((BYTE *)0x1000 < match_11 || local_aa0 + (long)match_11 == local_aa8) break;
              }
              if (dmsBt_2._4_4_ <= bestLength_2._4_4_) break;
              if (local_c48[(long)match_11] < local_aa0[(long)match_11]) {
                dmsBt_2._4_4_ = *(uint *)(matchLength_5 + 4);
                commonLengthLarger_2 = (size_t)match_11;
              }
              else {
                dmsBt_2._4_4_ = *(uint *)matchLength_5;
                dictBase_2 = match_11;
              }
            }
          }
          local_a90->nextToUpdate = mnum_2 - 8;
          local_a7c = dms_2._4_4_;
          UVar19 = local_a7c;
        }
LAB_00d00247:
        local_a7c = UVar19;
        local_1118 = local_a7c;
        dms_2._4_4_ = local_a7c;
        break;
      case 6:
      case 7:
        local_888 = local_1120;
        local_890 = local_1128;
        local_898 = local_1130;
        local_8a0 = local_1138;
        local_8a8 = local_1140;
        local_8ac = local_1144;
        local_8b8 = local_1150;
        local_8bc = cParams_1._4_4_;
        local_8c0 = (uint)cParams_1;
        cParams_5._4_4_ = 6;
        pZStack_8d0 = &local_1128->cParams;
        if ((local_1128->cParams).targetLength < 0xfff) {
          local_15f4 = (local_1128->cParams).targetLength;
        }
        else {
          local_15f4 = 0xfff;
        }
        base_5._4_4_ = local_15f4;
        _hashLog_3 = (local_1128->window).base;
        minMatch_4 = (int)local_ea0 - hashLog_3;
        local_8e8 = (local_1128->cParams).hashLog;
        hashTable_3._4_4_ = 4;
        h_3 = (size_t)local_1128->hashTable;
        local_858 = local_1138;
        local_860 = 6;
        local_85c = local_8e8;
        sStack_900 = ZSTD_hash6Ptr(local_1138,local_8e8);
        bt_3._4_4_ = *(uint *)(h_3 + sStack_900 * 4);
        _btMask_3 = local_890->chainTable;
        commonLengthSmaller_3._4_4_ = pZStack_8d0->chainLog - 1;
        commonLengthSmaller_3._0_4_ = (1 << ((byte)commonLengthSmaller_3._4_4_ & 0x1f)) - 1;
        commonLengthLarger_3 = 0;
        dictBase_3 = (BYTE *)0x0;
        pBStack_930 = (local_890->window).dictBase;
        dictEnd_3._4_4_ = (local_890->window).dictLimit;
        prefixStart_4 = pBStack_930 + dictEnd_3._4_4_;
        _windowLow_3 = _hashLog_3 + dictEnd_3._4_4_;
        if ((uint)commonLengthSmaller_3 < minMatch_4) {
          local_1604 = minMatch_4 - (uint)commonLengthSmaller_3;
        }
        else {
          local_1604 = 0;
        }
        matchLow_3 = local_1604;
        local_850 = sStack_900;
        local_950 = ZSTD_getLowestMatchIndex(local_890,minMatch_4,pZStack_8d0->windowLog);
        local_1608 = local_950;
        if (local_950 == 0) {
          local_1608 = 1;
        }
        smallerPtr_3._4_4_ = local_1608;
        largerPtr_3 = _btMask_3 + ((minMatch_4 & (uint)commonLengthSmaller_3) << 1);
        _dummy32_3 = _btMask_3 + (ulong)((minMatch_4 & (uint)commonLengthSmaller_3) << 1) + 1;
        mnum_3 = minMatch_4 + 9;
        dms_3._4_4_ = 0;
        dms_3._0_4_ = 1 << ((byte)pZStack_8d0->searchLog & 0x1f);
        if (local_8ac == 2) {
          local_1610 = local_890->dictMatchState;
        }
        else {
          local_1610 = (ZSTD_matchState_t *)0x0;
        }
        dmsCParams_3 = (ZSTD_compressionParameters *)local_1610;
        if (local_8ac == 2) {
          local_1618 = &local_1610->cParams;
        }
        else {
          local_1618 = (ZSTD_compressionParameters *)0x0;
        }
        dmsBase_3 = (BYTE *)local_1618;
        if (local_8ac == 2) {
          local_1620 = (local_1610->window).base;
        }
        else {
          local_1620 = (BYTE *)0x0;
        }
        dmsEnd_3 = local_1620;
        if (local_8ac == 2) {
          local_1628 = (local_1610->window).nextSrc;
        }
        else {
          local_1628 = (BYTE *)0x0;
        }
        _dmsLowLimit_3 = local_1628;
        if (local_8ac == 2) {
          local_162c = (int)local_1628 - (int)local_1620;
        }
        else {
          local_162c = 0;
        }
        dmsIndexDelta_3 = local_162c;
        if (local_8ac == 2) {
          local_1630 = (local_1610->window).lowLimit;
        }
        else {
          local_1630 = 0;
        }
        dmsHashLog_3 = local_1630;
        if (local_8ac == 2) {
          local_1634 = local_950 - local_162c;
        }
        else {
          local_1634 = 0;
        }
        dmsBtLog_3 = local_1634;
        if (local_8ac == 2) {
          local_1638 = local_1618->hashLog;
        }
        else {
          local_1638 = local_8e8;
        }
        dmsBtMask_3 = local_1638;
        if (local_8ac == 2) {
          local_163c = local_1618->chainLog - 1;
        }
        else {
          local_163c = commonLengthSmaller_3._4_4_;
        }
        dmsBtLow_3 = local_163c;
        if (local_8ac == 2) {
          local_1640 = (1 << ((byte)local_163c & 0x1f)) - 1;
        }
        else {
          local_1640 = 0;
        }
        local_9b0 = local_1640;
        if ((local_8ac == 2) && (local_1640 < local_162c - local_1630)) {
          local_1644 = local_162c - local_1640;
        }
        else {
          local_1644 = local_1630;
        }
        bestLength_3._4_4_ = local_1644;
        _repCode_3 = (BYTE *)(ulong)(local_8c0 - 1);
        repOffset_3 = local_8bc + 3;
        for (repIndex_3 = local_8bc; repIndex_3 < repOffset_3; repIndex_3 = repIndex_3 + 1) {
          if (repIndex_3 == 3) {
            local_1648 = *local_8b8 - 1;
          }
          else {
            local_1648 = local_8b8[repIndex_3];
          }
          repLen_3 = local_1648;
          local_9d0 = minMatch_4 - local_1648;
          repMatch_3._4_4_ = 0;
          if (local_1648 - 1 < minMatch_4 - dictEnd_3._4_4_) {
            bVar29 = local_950 <= local_9d0;
            UVar19 = ZSTD_readMINMATCH(local_8a0,hashTable_3._4_4_);
            UVar24 = ZSTD_readMINMATCH(local_8a0 + -(ulong)repLen_3,hashTable_3._4_4_);
            if (bVar29 && UVar19 == UVar24) {
              sVar26 = ZSTD_count(local_8a0 + hashTable_3._4_4_,
                                  local_8a0 + ((ulong)hashTable_3._4_4_ - (ulong)repLen_3),local_8a8
                                 );
              repMatch_3._4_4_ = (int)sVar26 + hashTable_3._4_4_;
            }
          }
          else {
            if (local_8ac == 2) {
              local_1658 = dmsEnd_3 + ((ulong)local_9d0 - (ulong)dmsBtLog_3);
            }
            else {
              local_1658 = pBStack_930 + local_9d0;
            }
            pBStack_9e0 = local_1658;
            if ((local_8ac == 1) &&
               (local_1648 - 1 < minMatch_4 - local_950 && 2 < (dictEnd_3._4_4_ - 1) - local_9d0)) {
              UVar19 = ZSTD_readMINMATCH(local_8a0,hashTable_3._4_4_);
              UVar24 = ZSTD_readMINMATCH(pBStack_9e0,hashTable_3._4_4_);
              if (UVar19 == UVar24) {
                sVar26 = ZSTD_count_2segments
                                   (local_8a0 + hashTable_3._4_4_,pBStack_9e0 + hashTable_3._4_4_,
                                    local_8a8,prefixStart_4,_windowLow_3);
                repMatch_3._4_4_ = (int)sVar26 + hashTable_3._4_4_;
              }
            }
            if ((local_8ac == 2) &&
               (repLen_3 - 1 < minMatch_4 - (dmsHashLog_3 + dmsBtLog_3) &&
                2 < (dictEnd_3._4_4_ - 1) - local_9d0)) {
              UVar19 = ZSTD_readMINMATCH(local_8a0,hashTable_3._4_4_);
              UVar24 = ZSTD_readMINMATCH(pBStack_9e0,hashTable_3._4_4_);
              if (UVar19 == UVar24) {
                sVar26 = ZSTD_count_2segments
                                   (local_8a0 + hashTable_3._4_4_,pBStack_9e0 + hashTable_3._4_4_,
                                    local_8a8,_dmsLowLimit_3,_windowLow_3);
                repMatch_3._4_4_ = (int)sVar26 + hashTable_3._4_4_;
              }
            }
          }
          if (_repCode_3 < (BYTE *)(ulong)repMatch_3._4_4_) {
            _repCode_3 = (BYTE *)(ulong)repMatch_3._4_4_;
            local_888[dms_3._4_4_].off = repIndex_3 - local_8bc;
            local_888[dms_3._4_4_].len = repMatch_3._4_4_;
            dms_3._4_4_ = dms_3._4_4_ + 1;
            UVar19 = dms_3._4_4_;
            if (base_5._4_4_ < repMatch_3._4_4_ || local_8a0 + repMatch_3._4_4_ == local_8a8)
            goto LAB_00d0165d;
          }
        }
        if (((cParams_5._4_4_ == 3) && (_repCode_3 < (BYTE *)0x3)) &&
           (mlen_3._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_890,local_898,local_8a0),
           smallerPtr_3._4_4_ <= mlen_3._4_4_ && minMatch_4 - mlen_3._4_4_ < 0x40000)) {
          if (((local_8ac == 0) || (local_8ac == 2)) || (dictEnd_3._4_4_ <= mlen_3._4_4_)) {
            match_13 = _hashLog_3 + mlen_3._4_4_;
            match_12 = (BYTE *)ZSTD_count(local_8a0,match_13,local_8a8);
          }
          else {
            nextPtr_6 = (U32 *)(pBStack_930 + mlen_3._4_4_);
            match_12 = (BYTE *)ZSTD_count_2segments
                                         (local_8a0,(BYTE *)nextPtr_6,local_8a8,prefixStart_4,
                                          _windowLow_3);
          }
          if (match_12 < (BYTE *)(ulong)cParams_5._4_4_) goto LAB_00d00ea1;
          _repCode_3 = match_12;
          local_888->off = (minMatch_4 - mlen_3._4_4_) + 2;
          local_888->len = (U32)match_12;
          dms_3._4_4_ = 1;
          if (match_12 <= (BYTE *)(ulong)base_5._4_4_ && local_8a0 + (long)match_12 != local_8a8)
          goto LAB_00d00ea1;
          local_890->nextToUpdate = minMatch_4 + 1;
          local_87c = 1;
          UVar19 = local_87c;
        }
        else {
LAB_00d00ea1:
          *(U32 *)(h_3 + sStack_900 * 4) = minMatch_4;
          while (iVar18 = (int)dms_3 + -1, bVar29 = (int)dms_3 != 0, dms_3._0_4_ = iVar18,
                bVar29 && smallerPtr_3._4_4_ <= bt_3._4_4_) {
            match_14 = (BYTE *)(_btMask_3 + ((bt_3._4_4_ & (uint)commonLengthSmaller_3) << 1));
            if (commonLengthLarger_3 < dictBase_3) {
              local_1670 = (BYTE *)commonLengthLarger_3;
            }
            else {
              local_1670 = dictBase_3;
            }
            dmsH_3 = (size_t)local_1670;
            if (((local_8ac == 0) || (local_8ac == 2)) ||
               ((BYTE *)(ulong)dictEnd_3._4_4_ <= local_1670 + bt_3._4_4_)) {
              matchLength_6 = (size_t)(_hashLog_3 + bt_3._4_4_);
              sVar26 = ZSTD_count(local_8a0 + (long)local_1670,
                                  (BYTE *)(matchLength_6 + (long)local_1670),local_8a8);
              dmsH_3 = sVar26 + dmsH_3;
            }
            else {
              matchLength_6 = (size_t)(pBStack_930 + bt_3._4_4_);
              sVar26 = ZSTD_count_2segments
                                 (local_8a0 + (long)local_1670,
                                  (BYTE *)(matchLength_6 + (long)local_1670),local_8a8,prefixStart_4
                                  ,_windowLow_3);
              dmsH_3 = sVar26 + dmsH_3;
              if ((ulong)dictEnd_3._4_4_ <= bt_3._4_4_ + dmsH_3) {
                matchLength_6 = (size_t)(_hashLog_3 + bt_3._4_4_);
              }
            }
            if (_repCode_3 < dmsH_3) {
              if (mnum_3 - bt_3._4_4_ < dmsH_3) {
                mnum_3 = bt_3._4_4_ + (U32)dmsH_3;
              }
              _repCode_3 = (BYTE *)dmsH_3;
              local_888[dms_3._4_4_].off = (minMatch_4 - bt_3._4_4_) + 2;
              local_888[dms_3._4_4_].len = (U32)dmsH_3;
              dms_3._4_4_ = dms_3._4_4_ + 1;
              if (0x1000 < dmsH_3 || local_8a0 + dmsH_3 == local_8a8) {
                if (local_8ac == 2) {
                  dms_3._0_4_ = 0;
                }
                break;
              }
            }
            if (*(byte *)(matchLength_6 + dmsH_3) < local_8a0[dmsH_3]) {
              *largerPtr_3 = bt_3._4_4_;
              commonLengthLarger_3 = dmsH_3;
              if (bt_3._4_4_ <= matchLow_3) {
                largerPtr_3 = &nbCompares_3;
                break;
              }
              largerPtr_3 = (U32 *)(match_14 + 4);
              bt_3._4_4_ = *(uint *)(match_14 + 4);
            }
            else {
              *_dummy32_3 = bt_3._4_4_;
              dictBase_3 = (BYTE *)dmsH_3;
              if (bt_3._4_4_ <= matchLow_3) {
                _dummy32_3 = &nbCompares_3;
                break;
              }
              _dummy32_3 = (U32 *)match_14;
              bt_3._4_4_ = *(uint *)match_14;
            }
          }
          *_dummy32_3 = 0;
          *largerPtr_3 = 0;
          if ((local_8ac == 2) && ((int)dms_3 != 0)) {
            local_870 = local_8a0;
            local_874 = dmsBtMask_3;
            local_878 = cParams_5._4_4_;
            switch(cParams_5._4_4_) {
            default:
              local_868 = ZSTD_hash4Ptr(local_8a0,dmsBtMask_3);
              break;
            case 5:
              local_868 = ZSTD_hash5Ptr(local_8a0,dmsBtMask_3);
              break;
            case 6:
              local_868 = ZSTD_hash6Ptr(local_8a0,dmsBtMask_3);
              break;
            case 7:
              local_868 = ZSTD_hash7Ptr(local_8a0,dmsBtMask_3);
              break;
            case 8:
              local_868 = ZSTD_hash8Ptr(local_8a0,dmsBtMask_3);
            }
            sStack_a20 = local_868;
            dmsBt_3._4_4_ = *(uint *)(*(long *)&dmsCParams_3[3].searchLog + local_868 * 4);
            nextPtr_7 = *(U32 **)(dmsCParams_3 + 4);
            dictBase_3 = (BYTE *)0x0;
            commonLengthLarger_3 = 0;
            while (iVar18 = (int)dms_3 + -1, bVar29 = (int)dms_3 != 0, dms_3._0_4_ = iVar18,
                  bVar29 && dmsHashLog_3 < dmsBt_3._4_4_) {
              matchLength_7 = (size_t)(nextPtr_7 + ((dmsBt_3._4_4_ & local_9b0) << 1));
              if (commonLengthLarger_3 < dictBase_3) {
                local_1688 = (BYTE *)commonLengthLarger_3;
              }
              else {
                local_1688 = dictBase_3;
              }
              match_15 = local_1688;
              local_a48 = dmsEnd_3 + dmsBt_3._4_4_;
              sVar26 = ZSTD_count_2segments
                                 (local_8a0 + (long)local_1688,local_a48 + (long)local_1688,
                                  local_8a8,_dmsLowLimit_3,_windowLow_3);
              match_15 = match_15 + sVar26;
              if ((BYTE *)(ulong)dmsIndexDelta_3 <= match_15 + dmsBt_3._4_4_) {
                local_a48 = _hashLog_3 + (ulong)dmsBtLog_3 + (ulong)dmsBt_3._4_4_;
              }
              if (_repCode_3 < match_15) {
                bt_3._4_4_ = dmsBt_3._4_4_ + dmsBtLog_3;
                if ((BYTE *)(ulong)(mnum_3 - bt_3._4_4_) < match_15) {
                  mnum_3 = bt_3._4_4_ + (U32)match_15;
                }
                local_888[dms_3._4_4_].off = (minMatch_4 - bt_3._4_4_) + 2;
                local_888[dms_3._4_4_].len = (U32)match_15;
                dms_3._4_4_ = dms_3._4_4_ + 1;
                _repCode_3 = match_15;
                if ((BYTE *)0x1000 < match_15 || local_8a0 + (long)match_15 == local_8a8) break;
              }
              if (dmsBt_3._4_4_ <= bestLength_3._4_4_) break;
              if (local_a48[(long)match_15] < local_8a0[(long)match_15]) {
                dmsBt_3._4_4_ = *(uint *)(matchLength_7 + 4);
                commonLengthLarger_3 = (size_t)match_15;
              }
              else {
                dmsBt_3._4_4_ = *(uint *)matchLength_7;
                dictBase_3 = match_15;
              }
            }
          }
          local_890->nextToUpdate = mnum_3 - 8;
          local_87c = dms_3._4_4_;
          UVar19 = local_87c;
        }
LAB_00d0165d:
        local_87c = UVar19;
        local_1118 = local_87c;
        dms_3._4_4_ = local_87c;
      }
    }
    maxML = local_1118;
    ZSTD_optLdm_processMatchCandidate
              ((ZSTD_optLdm_t *)&last_pos,matches_00,&maxML,(int)anchor - (int)ip,
               (int)ilimit - (int)anchor);
    if (maxML == 0) {
      anchor = anchor + 1;
    }
    else {
      for (maxOffset = 0; maxOffset < 3; maxOffset = maxOffset + 1) {
        pZVar1->rep[maxOffset] = local_1208[maxOffset];
      }
      pZVar1->mlen = 0;
      pZVar1->litlen = nbMatches;
      UVar19 = ZSTD_litLengthPrice(nbMatches,(optState_t *)istart,optStatePtr._4_4_);
      pZVar1->price = UVar19;
      lastSequence.price = matches_00[maxML - 1].len;
      if (nextToUpdate3 < (uint)lastSequence.price) {
        lastSequence.off = nbMatches;
        optLdm._52_4_ = matches_00[maxML - 1].off;
        litlen = 0;
        sol.mlen = lastSequence.mlen;
        sol.litlen = lastSequence.litlen;
        sol.price = lastSequence.price;
        sol.off = nbMatches;
        sol.rep[0] = lastSequence.rep[0];
        sol.rep[1] = (int)in_stack_ffffffffffffe694;
        sol.rep[2] = (int)((ulong)in_stack_ffffffffffffe694 >> 0x20);
        ll0 = ZSTD_totalLen(sol);
      }
      else {
        iVar18 = pZVar1->price;
        UVar19 = ZSTD_litLengthPrice(0,(optState_t *)istart,optStatePtr._4_4_);
        for (offset = 1; offset < local_1270; offset = offset + 1) {
          pZVar1[offset].price = 0x40000000;
        }
        for (end = 0; end < maxML; end = end + 1) {
          UVar24 = matches_00[end].off;
          uVar23 = matches_00[end].len;
          for (; offset <= uVar23; offset = offset + 1) {
            local_10c0 = offset;
            _price = istart;
            offCode = optStatePtr._4_4_;
            local_10bc = UVar24;
            mlCode = ZSTD_highbit32(UVar24 + 1);
            local_10d8 = local_10c0 - 3;
            if (*(int *)(_price + 0x50) == 1) {
              if (offCode == 0) {
                local_1690 = ZSTD_bitWeight(local_10d8);
              }
              else {
                local_1690 = ZSTD_fracWeight(local_10d8);
              }
              local_10b8 = local_1690 + (mlCode + 0x10) * 0x100;
            }
            else {
              iVar20 = mlCode * 0x100;
              iVar22 = *(int *)(_price + 0x4c);
              if (offCode == 0) {
                local_169c = ZSTD_bitWeight(*(U32 *)(*(long *)(_price + 0x18) + (ulong)mlCode * 4));
              }
              else {
                local_169c = ZSTD_fracWeight(*(U32 *)(*(long *)(_price + 0x18) + (ulong)mlCode * 4))
                ;
              }
              mlBase = iVar20 + (iVar22 - local_169c);
              if (((int)offCode < 2) && (0x13 < mlCode)) {
                mlBase = (mlCode - 0x13) * 0x200 + mlBase;
              }
              local_10dc = ZSTD_MLcode(local_10d8);
              UVar21 = ML_bits[local_10dc];
              iVar22 = *(int *)(_price + 0x48);
              if (offCode == 0) {
                local_16a8 = ZSTD_bitWeight(*(U32 *)(*(long *)(_price + 0x10) +
                                                    (ulong)local_10dc * 4));
              }
              else {
                local_16a8 = ZSTD_fracWeight(*(U32 *)(*(long *)(_price + 0x10) +
                                                     (ulong)local_10dc * 4));
              }
              mlBase = UVar21 * 0x100 + (iVar22 - local_16a8) + mlBase + 0x33;
              local_10b8 = mlBase;
            }
            pZVar1[offset].mlen = offset;
            pZVar1[offset].off = UVar24;
            pZVar1[offset].litlen = nbMatches;
            pZVar1[offset].price = iVar18 + UVar19 + local_10b8;
          }
        }
        ll0 = offset - 1;
        for (litlen = 1; litlen <= ll0; litlen = litlen + 1) {
          pBVar25 = anchor + litlen;
          if (pZVar1[litlen - 1].mlen == 0) {
            local_16ac = pZVar1[litlen - 1].litlen + 1;
          }
          else {
            local_16ac = 1;
          }
          iVar18 = pZVar1[litlen - 1].price;
          UVar19 = ZSTD_rawLiteralsCost
                             (anchor + ((ulong)litlen - 1),1,(optState_t *)istart,optStatePtr._4_4_)
          ;
          UVar24 = ZSTD_litLengthPrice(local_16ac,(optState_t *)istart,optStatePtr._4_4_);
          UVar21 = ZSTD_litLengthPrice(local_16ac - 1,(optState_t *)istart,optStatePtr._4_4_);
          newReps.rep[2] = (iVar18 + UVar19 + UVar24) - UVar21;
          if ((int)newReps.rep[2] <= pZVar1[litlen].price) {
            pZVar1[litlen].mlen = 0;
            pZVar1[litlen].off = 0;
            pZVar1[litlen].litlen = local_16ac;
            pZVar1[litlen].price = newReps.rep[2];
          }
          if (pZVar1[litlen].mlen == 0) {
            *(undefined8 *)pZVar1[litlen].rep = *(undefined8 *)pZVar1[litlen - 1].rep;
            pZVar1[litlen].rep[2] = pZVar1[litlen - 1].rep[2];
          }
          else {
            newReps.rep[1] = litlen - pZVar1[litlen].mlen;
            _litlen_2 = ZSTD_updateRep(pZVar1[newReps.rep[1]].rep,pZVar1[litlen].off,
                                       (uint)(pZVar1[litlen].litlen == 0));
            local_1340 = _litlen_2;
            newReps.rep[0] = local_1348;
            *(undefined8 *)pZVar1[litlen].rep = _litlen_2;
            pZVar1[litlen].rep[2] = local_1348;
          }
          if (pBVar25 <= base) {
            if (litlen == ll0) break;
            if ((optStatePtr._4_4_ != 0) || (pZVar1[litlen].price + 0x80 < pZVar1[litlen + 1].price)
               ) {
              previousPrice = (U32)(pZVar1[litlen].mlen != 0);
              if (pZVar1[litlen].mlen == 0) {
                local_16bc = pZVar1[litlen].litlen;
              }
              else {
                local_16bc = 0;
              }
              basePrice = local_16bc;
              UVar19 = pZVar1[litlen].price;
              nbMatches_1 = UVar19;
              UVar24 = ZSTD_litLengthPrice(0,(optState_t *)istart,optStatePtr._4_4_);
              matchNb_1 = UVar19 + UVar24;
              local_11d8 = pZVar1[litlen].rep;
              local_11b0 = local_11f8;
              local_11b8 = (U32 *)((long)&opt + 4);
              local_11c8 = ilimit;
              local_11cc = (int)optStatePtr;
              cParams_6._4_4_ = previousPrice;
              cParams_6._0_4_ = local_1270;
              pZStack_11e8 = &local_11f8->cParams;
              local_11ec = (local_11f8->cParams).minMatch;
              iVar18 = (int)pBVar25;
              local_11c0 = pBVar25;
              local_11a8 = matches_00;
              if (pBVar25 < (local_11f8->window).base + local_11f8->nextToUpdate) {
                local_11a0 = 0;
              }
              else {
                local_1170 = local_11f8;
                local_1180 = ilimit;
                base_6._0_4_ = (int)optStatePtr;
                _idx_1 = (local_11f8->window).base;
                forward_1 = iVar18 - (int)_idx_1;
                base_6._4_4_ = local_11ec;
                local_1178 = pBVar25;
                for (local_1198 = local_11f8->nextToUpdate; pBVar25 = local_6a0,
                    local_1198 < forward_1; local_1198 = local_119c + local_1198) {
                  local_119c = ZSTD_insertBt1(local_1170,_idx_1 + local_1198,local_1180,base_6._4_4_
                                              ,(uint)((int)base_6 == 1));
                }
                local_1170->nextToUpdate = forward_1;
                local_6a0._0_4_ = (int)local_11c0;
                iVar22 = (int)local_6a0;
                local_6a0 = pBVar25;
                switch(local_11ec) {
                case 3:
                  local_688 = local_11a8;
                  local_690 = local_11b0;
                  local_698 = local_11b8;
                  local_6a0 = local_11c0;
                  local_6a8 = local_11c8;
                  local_6ac = local_11cc;
                  local_6b8 = local_11d8;
                  local_6bc = cParams_6._4_4_;
                  local_6c0 = (uint)cParams_6;
                  cParams_7._4_4_ = 3;
                  pZStack_6d0 = &local_11b0->cParams;
                  if ((local_11b0->cParams).targetLength < 0xfff) {
                    local_16cc = (local_11b0->cParams).targetLength;
                  }
                  else {
                    local_16cc = 0xfff;
                  }
                  base_7._4_4_ = local_16cc;
                  _hashLog_4 = (local_11b0->window).base;
                  minMatch_5 = iVar22 - hashLog_4;
                  local_6e8 = (local_11b0->cParams).hashLog;
                  hashTable_4._4_4_ = 3;
                  h_4 = (size_t)local_11b0->hashTable;
                  local_658 = local_11c0;
                  local_660 = 3;
                  local_65c = local_6e8;
                  sStack_700 = ZSTD_hash4Ptr(local_11c0,local_6e8);
                  bt_4._4_4_ = *(uint *)(h_4 + sStack_700 * 4);
                  _btMask_4 = local_690->chainTable;
                  commonLengthSmaller_4._4_4_ = pZStack_6d0->chainLog - 1;
                  commonLengthSmaller_4._0_4_ =
                       (1 << ((byte)commonLengthSmaller_4._4_4_ & 0x1f)) - 1;
                  commonLengthLarger_4 = 0;
                  dictBase_4 = (BYTE *)0x0;
                  pBStack_730 = (local_690->window).dictBase;
                  dictEnd_4._4_4_ = (local_690->window).dictLimit;
                  prefixStart_5 = pBStack_730 + dictEnd_4._4_4_;
                  _windowLow_4 = _hashLog_4 + dictEnd_4._4_4_;
                  if ((uint)commonLengthSmaller_4 < minMatch_5) {
                    local_16dc = minMatch_5 - (uint)commonLengthSmaller_4;
                  }
                  else {
                    local_16dc = 0;
                  }
                  matchLow_4 = local_16dc;
                  local_650 = sStack_700;
                  local_750 = ZSTD_getLowestMatchIndex(local_690,minMatch_5,pZStack_6d0->windowLog);
                  local_16e0 = local_750;
                  if (local_750 == 0) {
                    local_16e0 = 1;
                  }
                  smallerPtr_4._4_4_ = local_16e0;
                  largerPtr_4 = _btMask_4 + ((minMatch_5 & (uint)commonLengthSmaller_4) << 1);
                  _dummy32_4 = _btMask_4 +
                               (ulong)((minMatch_5 & (uint)commonLengthSmaller_4) << 1) + 1;
                  mnum_4 = minMatch_5 + 9;
                  dms_4._4_4_ = 0;
                  dms_4._0_4_ = 1 << ((byte)pZStack_6d0->searchLog & 0x1f);
                  if (local_6ac == 2) {
                    local_16e8 = local_690->dictMatchState;
                  }
                  else {
                    local_16e8 = (ZSTD_matchState_t *)0x0;
                  }
                  dmsCParams_4 = (ZSTD_compressionParameters *)local_16e8;
                  if (local_6ac == 2) {
                    local_16f0 = &local_16e8->cParams;
                  }
                  else {
                    local_16f0 = (ZSTD_compressionParameters *)0x0;
                  }
                  dmsBase_4 = (BYTE *)local_16f0;
                  if (local_6ac == 2) {
                    local_16f8 = (local_16e8->window).base;
                  }
                  else {
                    local_16f8 = (BYTE *)0x0;
                  }
                  dmsEnd_4 = local_16f8;
                  if (local_6ac == 2) {
                    local_1700 = (local_16e8->window).nextSrc;
                  }
                  else {
                    local_1700 = (BYTE *)0x0;
                  }
                  _dmsLowLimit_4 = local_1700;
                  if (local_6ac == 2) {
                    local_1704 = (int)local_1700 - (int)local_16f8;
                  }
                  else {
                    local_1704 = 0;
                  }
                  dmsIndexDelta_4 = local_1704;
                  if (local_6ac == 2) {
                    local_1708 = (local_16e8->window).lowLimit;
                  }
                  else {
                    local_1708 = 0;
                  }
                  dmsHashLog_4 = local_1708;
                  if (local_6ac == 2) {
                    local_170c = local_750 - local_1704;
                  }
                  else {
                    local_170c = 0;
                  }
                  dmsBtLog_4 = local_170c;
                  if (local_6ac == 2) {
                    local_1710 = local_16f0->hashLog;
                  }
                  else {
                    local_1710 = local_6e8;
                  }
                  dmsBtMask_4 = local_1710;
                  if (local_6ac == 2) {
                    local_1714 = local_16f0->chainLog - 1;
                  }
                  else {
                    local_1714 = commonLengthSmaller_4._4_4_;
                  }
                  dmsBtLow_4 = local_1714;
                  if (local_6ac == 2) {
                    local_1718 = (1 << ((byte)local_1714 & 0x1f)) - 1;
                  }
                  else {
                    local_1718 = 0;
                  }
                  local_7b0 = local_1718;
                  if ((local_6ac == 2) && (local_1718 < local_1704 - local_1708)) {
                    local_171c = local_1704 - local_1718;
                  }
                  else {
                    local_171c = local_1708;
                  }
                  bestLength_4._4_4_ = local_171c;
                  _repCode_4 = (BYTE *)(ulong)(local_6c0 - 1);
                  repOffset_4 = local_6bc + 3;
                  for (repIndex_4 = local_6bc; repIndex_4 < repOffset_4; repIndex_4 = repIndex_4 + 1
                      ) {
                    if (repIndex_4 == 3) {
                      local_1720 = *local_6b8 - 1;
                    }
                    else {
                      local_1720 = local_6b8[repIndex_4];
                    }
                    repLen_4 = local_1720;
                    local_7d0 = minMatch_5 - local_1720;
                    repMatch_4._4_4_ = 0;
                    if (local_1720 - 1 < minMatch_5 - dictEnd_4._4_4_) {
                      bVar29 = local_750 <= local_7d0;
                      UVar19 = ZSTD_readMINMATCH(local_6a0,hashTable_4._4_4_);
                      UVar24 = ZSTD_readMINMATCH(local_6a0 + -(ulong)repLen_4,hashTable_4._4_4_);
                      if (bVar29 && UVar19 == UVar24) {
                        sVar26 = ZSTD_count(local_6a0 + hashTable_4._4_4_,
                                            local_6a0 + ((ulong)hashTable_4._4_4_ - (ulong)repLen_4)
                                            ,local_6a8);
                        repMatch_4._4_4_ = (int)sVar26 + hashTable_4._4_4_;
                      }
                    }
                    else {
                      if (local_6ac == 2) {
                        local_1730 = dmsEnd_4 + ((ulong)local_7d0 - (ulong)dmsBtLog_4);
                      }
                      else {
                        local_1730 = pBStack_730 + local_7d0;
                      }
                      pBStack_7e0 = local_1730;
                      if ((local_6ac == 1) &&
                         (local_1720 - 1 < minMatch_5 - local_750 &&
                          2 < (dictEnd_4._4_4_ - 1) - local_7d0)) {
                        UVar19 = ZSTD_readMINMATCH(local_6a0,hashTable_4._4_4_);
                        UVar24 = ZSTD_readMINMATCH(pBStack_7e0,hashTable_4._4_4_);
                        if (UVar19 == UVar24) {
                          sVar26 = ZSTD_count_2segments
                                             (local_6a0 + hashTable_4._4_4_,
                                              pBStack_7e0 + hashTable_4._4_4_,local_6a8,
                                              prefixStart_5,_windowLow_4);
                          repMatch_4._4_4_ = (int)sVar26 + hashTable_4._4_4_;
                        }
                      }
                      if ((local_6ac == 2) &&
                         (repLen_4 - 1 < minMatch_5 - (dmsHashLog_4 + dmsBtLog_4) &&
                          2 < (dictEnd_4._4_4_ - 1) - local_7d0)) {
                        UVar19 = ZSTD_readMINMATCH(local_6a0,hashTable_4._4_4_);
                        UVar24 = ZSTD_readMINMATCH(pBStack_7e0,hashTable_4._4_4_);
                        if (UVar19 == UVar24) {
                          sVar26 = ZSTD_count_2segments
                                             (local_6a0 + hashTable_4._4_4_,
                                              pBStack_7e0 + hashTable_4._4_4_,local_6a8,
                                              _dmsLowLimit_4,_windowLow_4);
                          repMatch_4._4_4_ = (int)sVar26 + hashTable_4._4_4_;
                        }
                      }
                    }
                    if (_repCode_4 < (BYTE *)(ulong)repMatch_4._4_4_) {
                      _repCode_4 = (BYTE *)(ulong)repMatch_4._4_4_;
                      local_688[dms_4._4_4_].off = repIndex_4 - local_6bc;
                      local_688[dms_4._4_4_].len = repMatch_4._4_4_;
                      dms_4._4_4_ = dms_4._4_4_ + 1;
                      UVar19 = dms_4._4_4_;
                      if (base_7._4_4_ < repMatch_4._4_4_ ||
                          local_6a0 + repMatch_4._4_4_ == local_6a8) goto LAB_00d035df;
                    }
                  }
                  if (((cParams_7._4_4_ == 3) && (_repCode_4 < (BYTE *)0x3)) &&
                     (mlen_4._4_4_ = ZSTD_insertAndFindFirstIndexHash3
                                               (local_690,local_698,local_6a0),
                     smallerPtr_4._4_4_ <= mlen_4._4_4_ && minMatch_5 - mlen_4._4_4_ < 0x40000)) {
                    if (((local_6ac == 0) || (local_6ac == 2)) || (dictEnd_4._4_4_ <= mlen_4._4_4_))
                    {
                      match_17 = _hashLog_4 + mlen_4._4_4_;
                      match_16 = (BYTE *)ZSTD_count(local_6a0,match_17,local_6a8);
                    }
                    else {
                      nextPtr_8 = (U32 *)(pBStack_730 + mlen_4._4_4_);
                      match_16 = (BYTE *)ZSTD_count_2segments
                                                   (local_6a0,(BYTE *)nextPtr_8,local_6a8,
                                                    prefixStart_5,_windowLow_4);
                    }
                    if (match_16 < (BYTE *)(ulong)cParams_7._4_4_) goto LAB_00d02e23;
                    _repCode_4 = match_16;
                    local_688->off = (minMatch_5 - mlen_4._4_4_) + 2;
                    local_688->len = (U32)match_16;
                    dms_4._4_4_ = 1;
                    if (match_16 <= (BYTE *)(ulong)base_7._4_4_ &&
                        local_6a0 + (long)match_16 != local_6a8) goto LAB_00d02e23;
                    local_690->nextToUpdate = minMatch_5 + 1;
                    local_67c = 1;
                    UVar19 = local_67c;
                  }
                  else {
LAB_00d02e23:
                    *(U32 *)(h_4 + sStack_700 * 4) = minMatch_5;
                    while (iVar22 = (int)dms_4 + -1, bVar29 = (int)dms_4 != 0, dms_4._0_4_ = iVar22,
                          bVar29 && smallerPtr_4._4_4_ <= bt_4._4_4_) {
                      match_18 = (BYTE *)(_btMask_4 +
                                         ((bt_4._4_4_ & (uint)commonLengthSmaller_4) << 1));
                      if (commonLengthLarger_4 < dictBase_4) {
                        local_1748 = (BYTE *)commonLengthLarger_4;
                      }
                      else {
                        local_1748 = dictBase_4;
                      }
                      dmsH_4 = (size_t)local_1748;
                      if (((local_6ac == 0) || (local_6ac == 2)) ||
                         ((BYTE *)(ulong)dictEnd_4._4_4_ <= local_1748 + bt_4._4_4_)) {
                        matchLength_8 = (size_t)(_hashLog_4 + bt_4._4_4_);
                        sVar26 = ZSTD_count(local_6a0 + (long)local_1748,
                                            (BYTE *)(matchLength_8 + (long)local_1748),local_6a8);
                        dmsH_4 = sVar26 + dmsH_4;
                      }
                      else {
                        matchLength_8 = (size_t)(pBStack_730 + bt_4._4_4_);
                        sVar26 = ZSTD_count_2segments
                                           (local_6a0 + (long)local_1748,
                                            (BYTE *)(matchLength_8 + (long)local_1748),local_6a8,
                                            prefixStart_5,_windowLow_4);
                        dmsH_4 = sVar26 + dmsH_4;
                        if ((ulong)dictEnd_4._4_4_ <= bt_4._4_4_ + dmsH_4) {
                          matchLength_8 = (size_t)(_hashLog_4 + bt_4._4_4_);
                        }
                      }
                      if (_repCode_4 < dmsH_4) {
                        if (mnum_4 - bt_4._4_4_ < dmsH_4) {
                          mnum_4 = bt_4._4_4_ + (U32)dmsH_4;
                        }
                        _repCode_4 = (BYTE *)dmsH_4;
                        local_688[dms_4._4_4_].off = (minMatch_5 - bt_4._4_4_) + 2;
                        local_688[dms_4._4_4_].len = (U32)dmsH_4;
                        dms_4._4_4_ = dms_4._4_4_ + 1;
                        if (0x1000 < dmsH_4 || local_6a0 + dmsH_4 == local_6a8) {
                          if (local_6ac == 2) {
                            dms_4._0_4_ = 0;
                          }
                          break;
                        }
                      }
                      if (*(byte *)(matchLength_8 + dmsH_4) < local_6a0[dmsH_4]) {
                        *largerPtr_4 = bt_4._4_4_;
                        commonLengthLarger_4 = dmsH_4;
                        if (bt_4._4_4_ <= matchLow_4) {
                          largerPtr_4 = &nbCompares_4;
                          break;
                        }
                        largerPtr_4 = (U32 *)(match_18 + 4);
                        bt_4._4_4_ = *(uint *)(match_18 + 4);
                      }
                      else {
                        *_dummy32_4 = bt_4._4_4_;
                        dictBase_4 = (BYTE *)dmsH_4;
                        if (bt_4._4_4_ <= matchLow_4) {
                          _dummy32_4 = &nbCompares_4;
                          break;
                        }
                        _dummy32_4 = (U32 *)match_18;
                        bt_4._4_4_ = *(uint *)match_18;
                      }
                    }
                    *_dummy32_4 = 0;
                    *largerPtr_4 = 0;
                    if ((local_6ac == 2) && ((int)dms_4 != 0)) {
                      local_670 = local_6a0;
                      local_674 = dmsBtMask_4;
                      local_678 = cParams_7._4_4_;
                      switch(cParams_7._4_4_) {
                      default:
                        local_668 = ZSTD_hash4Ptr(local_6a0,dmsBtMask_4);
                        break;
                      case 5:
                        local_668 = ZSTD_hash5Ptr(local_6a0,dmsBtMask_4);
                        break;
                      case 6:
                        local_668 = ZSTD_hash6Ptr(local_6a0,dmsBtMask_4);
                        break;
                      case 7:
                        local_668 = ZSTD_hash7Ptr(local_6a0,dmsBtMask_4);
                        break;
                      case 8:
                        local_668 = ZSTD_hash8Ptr(local_6a0,dmsBtMask_4);
                      }
                      sStack_820 = local_668;
                      dmsBt_4._4_4_ = *(uint *)(*(long *)&dmsCParams_4[3].searchLog + local_668 * 4)
                      ;
                      nextPtr_9 = *(U32 **)(dmsCParams_4 + 4);
                      dictBase_4 = (BYTE *)0x0;
                      commonLengthLarger_4 = 0;
                      while (iVar22 = (int)dms_4 + -1, bVar29 = (int)dms_4 != 0,
                            dms_4._0_4_ = iVar22, bVar29 && dmsHashLog_4 < dmsBt_4._4_4_) {
                        matchLength_9 = (size_t)(nextPtr_9 + ((dmsBt_4._4_4_ & local_7b0) << 1));
                        if (commonLengthLarger_4 < dictBase_4) {
                          local_1760 = (BYTE *)commonLengthLarger_4;
                        }
                        else {
                          local_1760 = dictBase_4;
                        }
                        match_19 = local_1760;
                        local_848 = dmsEnd_4 + dmsBt_4._4_4_;
                        sVar26 = ZSTD_count_2segments
                                           (local_6a0 + (long)local_1760,
                                            local_848 + (long)local_1760,local_6a8,_dmsLowLimit_4,
                                            _windowLow_4);
                        match_19 = match_19 + sVar26;
                        if ((BYTE *)(ulong)dmsIndexDelta_4 <= match_19 + dmsBt_4._4_4_) {
                          local_848 = _hashLog_4 + (ulong)dmsBtLog_4 + (ulong)dmsBt_4._4_4_;
                        }
                        if (_repCode_4 < match_19) {
                          bt_4._4_4_ = dmsBt_4._4_4_ + dmsBtLog_4;
                          if ((BYTE *)(ulong)(mnum_4 - bt_4._4_4_) < match_19) {
                            mnum_4 = bt_4._4_4_ + (U32)match_19;
                          }
                          local_688[dms_4._4_4_].off = (minMatch_5 - bt_4._4_4_) + 2;
                          local_688[dms_4._4_4_].len = (U32)match_19;
                          dms_4._4_4_ = dms_4._4_4_ + 1;
                          _repCode_4 = match_19;
                          if ((BYTE *)0x1000 < match_19 || local_6a0 + (long)match_19 == local_6a8)
                          break;
                        }
                        if (dmsBt_4._4_4_ <= bestLength_4._4_4_) break;
                        if (local_848[(long)match_19] < local_6a0[(long)match_19]) {
                          dmsBt_4._4_4_ = *(uint *)(matchLength_9 + 4);
                          commonLengthLarger_4 = (size_t)match_19;
                        }
                        else {
                          dmsBt_4._4_4_ = *(uint *)matchLength_9;
                          dictBase_4 = match_19;
                        }
                      }
                    }
                    local_690->nextToUpdate = mnum_4 - 8;
                    local_67c = dms_4._4_4_;
                    UVar19 = local_67c;
                  }
LAB_00d035df:
                  local_67c = UVar19;
                  local_11a0 = local_67c;
                  dms_4._4_4_ = local_67c;
                  break;
                default:
                  local_488 = local_11a8;
                  local_490 = local_11b0;
                  local_498 = local_11b8;
                  local_4a0 = local_11c0;
                  local_4a8 = local_11c8;
                  local_4ac = local_11cc;
                  local_4b8 = local_11d8;
                  local_4bc = cParams_6._4_4_;
                  local_4c0 = (uint)cParams_6;
                  cParams_8._4_4_ = 4;
                  pZStack_4d0 = &local_11b0->cParams;
                  if ((local_11b0->cParams).targetLength < 0xfff) {
                    local_1764 = (local_11b0->cParams).targetLength;
                  }
                  else {
                    local_1764 = 0xfff;
                  }
                  base_8._4_4_ = local_1764;
                  _hashLog_5 = (local_11b0->window).base;
                  minMatch_6 = (int)local_6a0 - hashLog_5;
                  local_4e8 = (local_11b0->cParams).hashLog;
                  hashTable_5._4_4_ = 4;
                  h_5 = (size_t)local_11b0->hashTable;
                  local_458 = local_11c0;
                  local_460 = 4;
                  local_45c = local_4e8;
                  sStack_500 = ZSTD_hash4Ptr(local_11c0,local_4e8);
                  bt_5._4_4_ = *(uint *)(h_5 + sStack_500 * 4);
                  _btMask_5 = local_490->chainTable;
                  commonLengthSmaller_5._4_4_ = pZStack_4d0->chainLog - 1;
                  commonLengthSmaller_5._0_4_ =
                       (1 << ((byte)commonLengthSmaller_5._4_4_ & 0x1f)) - 1;
                  commonLengthLarger_5 = 0;
                  dictBase_5 = (BYTE *)0x0;
                  pBStack_530 = (local_490->window).dictBase;
                  dictEnd_5._4_4_ = (local_490->window).dictLimit;
                  prefixStart_6 = pBStack_530 + dictEnd_5._4_4_;
                  _windowLow_5 = _hashLog_5 + dictEnd_5._4_4_;
                  if ((uint)commonLengthSmaller_5 < minMatch_6) {
                    local_1774 = minMatch_6 - (uint)commonLengthSmaller_5;
                  }
                  else {
                    local_1774 = 0;
                  }
                  matchLow_5 = local_1774;
                  local_450 = sStack_500;
                  local_550 = ZSTD_getLowestMatchIndex(local_490,minMatch_6,pZStack_4d0->windowLog);
                  local_1778 = local_550;
                  if (local_550 == 0) {
                    local_1778 = 1;
                  }
                  smallerPtr_5._4_4_ = local_1778;
                  largerPtr_5 = _btMask_5 + ((minMatch_6 & (uint)commonLengthSmaller_5) << 1);
                  _dummy32_5 = _btMask_5 +
                               (ulong)((minMatch_6 & (uint)commonLengthSmaller_5) << 1) + 1;
                  mnum_5 = minMatch_6 + 9;
                  dms_5._4_4_ = 0;
                  dms_5._0_4_ = 1 << ((byte)pZStack_4d0->searchLog & 0x1f);
                  if (local_4ac == 2) {
                    local_1780 = local_490->dictMatchState;
                  }
                  else {
                    local_1780 = (ZSTD_matchState_t *)0x0;
                  }
                  dmsCParams_5 = (ZSTD_compressionParameters *)local_1780;
                  if (local_4ac == 2) {
                    local_1788 = &local_1780->cParams;
                  }
                  else {
                    local_1788 = (ZSTD_compressionParameters *)0x0;
                  }
                  dmsBase_5 = (BYTE *)local_1788;
                  if (local_4ac == 2) {
                    local_1790 = (local_1780->window).base;
                  }
                  else {
                    local_1790 = (BYTE *)0x0;
                  }
                  dmsEnd_5 = local_1790;
                  if (local_4ac == 2) {
                    local_1798 = (local_1780->window).nextSrc;
                  }
                  else {
                    local_1798 = (BYTE *)0x0;
                  }
                  _dmsLowLimit_5 = local_1798;
                  if (local_4ac == 2) {
                    local_179c = (int)local_1798 - (int)local_1790;
                  }
                  else {
                    local_179c = 0;
                  }
                  dmsIndexDelta_5 = local_179c;
                  if (local_4ac == 2) {
                    local_17a0 = (local_1780->window).lowLimit;
                  }
                  else {
                    local_17a0 = 0;
                  }
                  dmsHashLog_5 = local_17a0;
                  if (local_4ac == 2) {
                    local_17a4 = local_550 - local_179c;
                  }
                  else {
                    local_17a4 = 0;
                  }
                  dmsBtLog_5 = local_17a4;
                  if (local_4ac == 2) {
                    local_17a8 = local_1788->hashLog;
                  }
                  else {
                    local_17a8 = local_4e8;
                  }
                  dmsBtMask_5 = local_17a8;
                  if (local_4ac == 2) {
                    local_17ac = local_1788->chainLog - 1;
                  }
                  else {
                    local_17ac = commonLengthSmaller_5._4_4_;
                  }
                  dmsBtLow_5 = local_17ac;
                  if (local_4ac == 2) {
                    local_17b0 = (1 << ((byte)local_17ac & 0x1f)) - 1;
                  }
                  else {
                    local_17b0 = 0;
                  }
                  local_5b0 = local_17b0;
                  if ((local_4ac == 2) && (local_17b0 < local_179c - local_17a0)) {
                    local_17b4 = local_179c - local_17b0;
                  }
                  else {
                    local_17b4 = local_17a0;
                  }
                  bestLength_5._4_4_ = local_17b4;
                  _repCode_5 = (BYTE *)(ulong)(local_4c0 - 1);
                  repOffset_5 = local_4bc + 3;
                  for (repIndex_5 = local_4bc; repIndex_5 < repOffset_5; repIndex_5 = repIndex_5 + 1
                      ) {
                    if (repIndex_5 == 3) {
                      local_17b8 = *local_4b8 - 1;
                    }
                    else {
                      local_17b8 = local_4b8[repIndex_5];
                    }
                    repLen_5 = local_17b8;
                    local_5d0 = minMatch_6 - local_17b8;
                    repMatch_5._4_4_ = 0;
                    if (local_17b8 - 1 < minMatch_6 - dictEnd_5._4_4_) {
                      bVar29 = local_550 <= local_5d0;
                      UVar19 = ZSTD_readMINMATCH(local_4a0,hashTable_5._4_4_);
                      UVar24 = ZSTD_readMINMATCH(local_4a0 + -(ulong)repLen_5,hashTable_5._4_4_);
                      if (bVar29 && UVar19 == UVar24) {
                        sVar26 = ZSTD_count(local_4a0 + hashTable_5._4_4_,
                                            local_4a0 + ((ulong)hashTable_5._4_4_ - (ulong)repLen_5)
                                            ,local_4a8);
                        repMatch_5._4_4_ = (int)sVar26 + hashTable_5._4_4_;
                      }
                    }
                    else {
                      if (local_4ac == 2) {
                        local_17c8 = dmsEnd_5 + ((ulong)local_5d0 - (ulong)dmsBtLog_5);
                      }
                      else {
                        local_17c8 = pBStack_530 + local_5d0;
                      }
                      pBStack_5e0 = local_17c8;
                      if ((local_4ac == 1) &&
                         (local_17b8 - 1 < minMatch_6 - local_550 &&
                          2 < (dictEnd_5._4_4_ - 1) - local_5d0)) {
                        UVar19 = ZSTD_readMINMATCH(local_4a0,hashTable_5._4_4_);
                        UVar24 = ZSTD_readMINMATCH(pBStack_5e0,hashTable_5._4_4_);
                        if (UVar19 == UVar24) {
                          sVar26 = ZSTD_count_2segments
                                             (local_4a0 + hashTable_5._4_4_,
                                              pBStack_5e0 + hashTable_5._4_4_,local_4a8,
                                              prefixStart_6,_windowLow_5);
                          repMatch_5._4_4_ = (int)sVar26 + hashTable_5._4_4_;
                        }
                      }
                      if ((local_4ac == 2) &&
                         (repLen_5 - 1 < minMatch_6 - (dmsHashLog_5 + dmsBtLog_5) &&
                          2 < (dictEnd_5._4_4_ - 1) - local_5d0)) {
                        UVar19 = ZSTD_readMINMATCH(local_4a0,hashTable_5._4_4_);
                        UVar24 = ZSTD_readMINMATCH(pBStack_5e0,hashTable_5._4_4_);
                        if (UVar19 == UVar24) {
                          sVar26 = ZSTD_count_2segments
                                             (local_4a0 + hashTable_5._4_4_,
                                              pBStack_5e0 + hashTable_5._4_4_,local_4a8,
                                              _dmsLowLimit_5,_windowLow_5);
                          repMatch_5._4_4_ = (int)sVar26 + hashTable_5._4_4_;
                        }
                      }
                    }
                    if (_repCode_5 < (BYTE *)(ulong)repMatch_5._4_4_) {
                      _repCode_5 = (BYTE *)(ulong)repMatch_5._4_4_;
                      local_488[dms_5._4_4_].off = repIndex_5 - local_4bc;
                      local_488[dms_5._4_4_].len = repMatch_5._4_4_;
                      dms_5._4_4_ = dms_5._4_4_ + 1;
                      UVar19 = dms_5._4_4_;
                      if (base_8._4_4_ < repMatch_5._4_4_ ||
                          local_4a0 + repMatch_5._4_4_ == local_4a8) goto LAB_00d049f7;
                    }
                  }
                  if (((cParams_8._4_4_ == 3) && (_repCode_5 < (BYTE *)0x3)) &&
                     (mlen_5._4_4_ = ZSTD_insertAndFindFirstIndexHash3
                                               (local_490,local_498,local_4a0),
                     smallerPtr_5._4_4_ <= mlen_5._4_4_ && minMatch_6 - mlen_5._4_4_ < 0x40000)) {
                    if (((local_4ac == 0) || (local_4ac == 2)) || (dictEnd_5._4_4_ <= mlen_5._4_4_))
                    {
                      match_21 = _hashLog_5 + mlen_5._4_4_;
                      match_20 = (BYTE *)ZSTD_count(local_4a0,match_21,local_4a8);
                    }
                    else {
                      nextPtr_10 = (U32 *)(pBStack_530 + mlen_5._4_4_);
                      match_20 = (BYTE *)ZSTD_count_2segments
                                                   (local_4a0,(BYTE *)nextPtr_10,local_4a8,
                                                    prefixStart_6,_windowLow_5);
                    }
                    if (match_20 < (BYTE *)(ulong)cParams_8._4_4_) goto LAB_00d0423b;
                    _repCode_5 = match_20;
                    local_488->off = (minMatch_6 - mlen_5._4_4_) + 2;
                    local_488->len = (U32)match_20;
                    dms_5._4_4_ = 1;
                    if (match_20 <= (BYTE *)(ulong)base_8._4_4_ &&
                        local_4a0 + (long)match_20 != local_4a8) goto LAB_00d0423b;
                    local_490->nextToUpdate = minMatch_6 + 1;
                    local_47c = 1;
                    UVar19 = local_47c;
                  }
                  else {
LAB_00d0423b:
                    *(U32 *)(h_5 + sStack_500 * 4) = minMatch_6;
                    while (iVar22 = (int)dms_5 + -1, bVar29 = (int)dms_5 != 0, dms_5._0_4_ = iVar22,
                          bVar29 && smallerPtr_5._4_4_ <= bt_5._4_4_) {
                      match_22 = (BYTE *)(_btMask_5 +
                                         ((bt_5._4_4_ & (uint)commonLengthSmaller_5) << 1));
                      if (commonLengthLarger_5 < dictBase_5) {
                        local_17e0 = (BYTE *)commonLengthLarger_5;
                      }
                      else {
                        local_17e0 = dictBase_5;
                      }
                      dmsH_5 = (size_t)local_17e0;
                      if (((local_4ac == 0) || (local_4ac == 2)) ||
                         ((BYTE *)(ulong)dictEnd_5._4_4_ <= local_17e0 + bt_5._4_4_)) {
                        matchLength_10 = (size_t)(_hashLog_5 + bt_5._4_4_);
                        sVar26 = ZSTD_count(local_4a0 + (long)local_17e0,
                                            (BYTE *)(matchLength_10 + (long)local_17e0),local_4a8);
                        dmsH_5 = sVar26 + dmsH_5;
                      }
                      else {
                        matchLength_10 = (size_t)(pBStack_530 + bt_5._4_4_);
                        sVar26 = ZSTD_count_2segments
                                           (local_4a0 + (long)local_17e0,
                                            (BYTE *)(matchLength_10 + (long)local_17e0),local_4a8,
                                            prefixStart_6,_windowLow_5);
                        dmsH_5 = sVar26 + dmsH_5;
                        if ((ulong)dictEnd_5._4_4_ <= bt_5._4_4_ + dmsH_5) {
                          matchLength_10 = (size_t)(_hashLog_5 + bt_5._4_4_);
                        }
                      }
                      if (_repCode_5 < dmsH_5) {
                        if (mnum_5 - bt_5._4_4_ < dmsH_5) {
                          mnum_5 = bt_5._4_4_ + (U32)dmsH_5;
                        }
                        _repCode_5 = (BYTE *)dmsH_5;
                        local_488[dms_5._4_4_].off = (minMatch_6 - bt_5._4_4_) + 2;
                        local_488[dms_5._4_4_].len = (U32)dmsH_5;
                        dms_5._4_4_ = dms_5._4_4_ + 1;
                        if (0x1000 < dmsH_5 || local_4a0 + dmsH_5 == local_4a8) {
                          if (local_4ac == 2) {
                            dms_5._0_4_ = 0;
                          }
                          break;
                        }
                      }
                      if (*(byte *)(matchLength_10 + dmsH_5) < local_4a0[dmsH_5]) {
                        *largerPtr_5 = bt_5._4_4_;
                        commonLengthLarger_5 = dmsH_5;
                        if (bt_5._4_4_ <= matchLow_5) {
                          largerPtr_5 = &nbCompares_5;
                          break;
                        }
                        largerPtr_5 = (U32 *)(match_22 + 4);
                        bt_5._4_4_ = *(uint *)(match_22 + 4);
                      }
                      else {
                        *_dummy32_5 = bt_5._4_4_;
                        dictBase_5 = (BYTE *)dmsH_5;
                        if (bt_5._4_4_ <= matchLow_5) {
                          _dummy32_5 = &nbCompares_5;
                          break;
                        }
                        _dummy32_5 = (U32 *)match_22;
                        bt_5._4_4_ = *(uint *)match_22;
                      }
                    }
                    *_dummy32_5 = 0;
                    *largerPtr_5 = 0;
                    if ((local_4ac == 2) && ((int)dms_5 != 0)) {
                      local_470 = local_4a0;
                      local_474 = dmsBtMask_5;
                      local_478 = cParams_8._4_4_;
                      switch(cParams_8._4_4_) {
                      default:
                        local_468 = ZSTD_hash4Ptr(local_4a0,dmsBtMask_5);
                        break;
                      case 5:
                        local_468 = ZSTD_hash5Ptr(local_4a0,dmsBtMask_5);
                        break;
                      case 6:
                        local_468 = ZSTD_hash6Ptr(local_4a0,dmsBtMask_5);
                        break;
                      case 7:
                        local_468 = ZSTD_hash7Ptr(local_4a0,dmsBtMask_5);
                        break;
                      case 8:
                        local_468 = ZSTD_hash8Ptr(local_4a0,dmsBtMask_5);
                      }
                      sStack_620 = local_468;
                      dmsBt_5._4_4_ = *(uint *)(*(long *)&dmsCParams_5[3].searchLog + local_468 * 4)
                      ;
                      nextPtr_11 = *(U32 **)(dmsCParams_5 + 4);
                      dictBase_5 = (BYTE *)0x0;
                      commonLengthLarger_5 = 0;
                      while (iVar22 = (int)dms_5 + -1, bVar29 = (int)dms_5 != 0,
                            dms_5._0_4_ = iVar22, bVar29 && dmsHashLog_5 < dmsBt_5._4_4_) {
                        matchLength_11 = (size_t)(nextPtr_11 + ((dmsBt_5._4_4_ & local_5b0) << 1));
                        if (commonLengthLarger_5 < dictBase_5) {
                          local_17f8 = (BYTE *)commonLengthLarger_5;
                        }
                        else {
                          local_17f8 = dictBase_5;
                        }
                        match_23 = local_17f8;
                        local_648 = dmsEnd_5 + dmsBt_5._4_4_;
                        sVar26 = ZSTD_count_2segments
                                           (local_4a0 + (long)local_17f8,
                                            local_648 + (long)local_17f8,local_4a8,_dmsLowLimit_5,
                                            _windowLow_5);
                        match_23 = match_23 + sVar26;
                        if ((BYTE *)(ulong)dmsIndexDelta_5 <= match_23 + dmsBt_5._4_4_) {
                          local_648 = _hashLog_5 + (ulong)dmsBtLog_5 + (ulong)dmsBt_5._4_4_;
                        }
                        if (_repCode_5 < match_23) {
                          bt_5._4_4_ = dmsBt_5._4_4_ + dmsBtLog_5;
                          if ((BYTE *)(ulong)(mnum_5 - bt_5._4_4_) < match_23) {
                            mnum_5 = bt_5._4_4_ + (U32)match_23;
                          }
                          local_488[dms_5._4_4_].off = (minMatch_6 - bt_5._4_4_) + 2;
                          local_488[dms_5._4_4_].len = (U32)match_23;
                          dms_5._4_4_ = dms_5._4_4_ + 1;
                          _repCode_5 = match_23;
                          if ((BYTE *)0x1000 < match_23 || local_4a0 + (long)match_23 == local_4a8)
                          break;
                        }
                        if (dmsBt_5._4_4_ <= bestLength_5._4_4_) break;
                        if (local_648[(long)match_23] < local_4a0[(long)match_23]) {
                          dmsBt_5._4_4_ = *(uint *)(matchLength_11 + 4);
                          commonLengthLarger_5 = (size_t)match_23;
                        }
                        else {
                          dmsBt_5._4_4_ = *(uint *)matchLength_11;
                          dictBase_5 = match_23;
                        }
                      }
                    }
                    local_490->nextToUpdate = mnum_5 - 8;
                    local_47c = dms_5._4_4_;
                    UVar19 = local_47c;
                  }
LAB_00d049f7:
                  local_47c = UVar19;
                  local_11a0 = local_47c;
                  dms_5._4_4_ = local_47c;
                  break;
                case 5:
                  local_288 = local_11a8;
                  local_290 = local_11b0;
                  local_298 = local_11b8;
                  local_2a0 = local_11c0;
                  local_2a8 = local_11c8;
                  local_2ac = local_11cc;
                  local_2b8 = local_11d8;
                  local_2bc = cParams_6._4_4_;
                  local_2c0 = (uint)cParams_6;
                  cParams_9._4_4_ = 5;
                  pZStack_2d0 = &local_11b0->cParams;
                  if ((local_11b0->cParams).targetLength < 0xfff) {
                    local_17fc = (local_11b0->cParams).targetLength;
                  }
                  else {
                    local_17fc = 0xfff;
                  }
                  base_9._4_4_ = local_17fc;
                  _hashLog_6 = (local_11b0->window).base;
                  minMatch_7 = (int)local_6a0 - hashLog_6;
                  local_2e8 = (local_11b0->cParams).hashLog;
                  hashTable_6._4_4_ = 4;
                  h_6 = (size_t)local_11b0->hashTable;
                  local_258 = local_11c0;
                  local_260 = 5;
                  local_25c = local_2e8;
                  sStack_300 = ZSTD_hash5Ptr(local_11c0,local_2e8);
                  bt_6._4_4_ = *(uint *)(h_6 + sStack_300 * 4);
                  _btMask_6 = local_290->chainTable;
                  commonLengthSmaller_6._4_4_ = pZStack_2d0->chainLog - 1;
                  commonLengthSmaller_6._0_4_ =
                       (1 << ((byte)commonLengthSmaller_6._4_4_ & 0x1f)) - 1;
                  commonLengthLarger_6 = 0;
                  dictBase_6 = (BYTE *)0x0;
                  pBStack_330 = (local_290->window).dictBase;
                  dictEnd_6._4_4_ = (local_290->window).dictLimit;
                  prefixStart_7 = pBStack_330 + dictEnd_6._4_4_;
                  _windowLow_6 = _hashLog_6 + dictEnd_6._4_4_;
                  if ((uint)commonLengthSmaller_6 < minMatch_7) {
                    local_180c = minMatch_7 - (uint)commonLengthSmaller_6;
                  }
                  else {
                    local_180c = 0;
                  }
                  matchLow_6 = local_180c;
                  local_250 = sStack_300;
                  local_350 = ZSTD_getLowestMatchIndex(local_290,minMatch_7,pZStack_2d0->windowLog);
                  local_1810 = local_350;
                  if (local_350 == 0) {
                    local_1810 = 1;
                  }
                  smallerPtr_6._4_4_ = local_1810;
                  largerPtr_6 = _btMask_6 + ((minMatch_7 & (uint)commonLengthSmaller_6) << 1);
                  _dummy32_6 = _btMask_6 +
                               (ulong)((minMatch_7 & (uint)commonLengthSmaller_6) << 1) + 1;
                  mnum_6 = minMatch_7 + 9;
                  dms_6._4_4_ = 0;
                  dms_6._0_4_ = 1 << ((byte)pZStack_2d0->searchLog & 0x1f);
                  if (local_2ac == 2) {
                    local_1818 = local_290->dictMatchState;
                  }
                  else {
                    local_1818 = (ZSTD_matchState_t *)0x0;
                  }
                  dmsCParams_6 = (ZSTD_compressionParameters *)local_1818;
                  if (local_2ac == 2) {
                    local_1820 = &local_1818->cParams;
                  }
                  else {
                    local_1820 = (ZSTD_compressionParameters *)0x0;
                  }
                  dmsBase_6 = (BYTE *)local_1820;
                  if (local_2ac == 2) {
                    local_1828 = (local_1818->window).base;
                  }
                  else {
                    local_1828 = (BYTE *)0x0;
                  }
                  dmsEnd_6 = local_1828;
                  if (local_2ac == 2) {
                    local_1830 = (local_1818->window).nextSrc;
                  }
                  else {
                    local_1830 = (BYTE *)0x0;
                  }
                  _dmsLowLimit_6 = local_1830;
                  if (local_2ac == 2) {
                    local_1834 = (int)local_1830 - (int)local_1828;
                  }
                  else {
                    local_1834 = 0;
                  }
                  dmsIndexDelta_6 = local_1834;
                  if (local_2ac == 2) {
                    local_1838 = (local_1818->window).lowLimit;
                  }
                  else {
                    local_1838 = 0;
                  }
                  dmsHashLog_6 = local_1838;
                  if (local_2ac == 2) {
                    local_183c = local_350 - local_1834;
                  }
                  else {
                    local_183c = 0;
                  }
                  dmsBtLog_6 = local_183c;
                  if (local_2ac == 2) {
                    local_1840 = local_1820->hashLog;
                  }
                  else {
                    local_1840 = local_2e8;
                  }
                  dmsBtMask_6 = local_1840;
                  if (local_2ac == 2) {
                    local_1844 = local_1820->chainLog - 1;
                  }
                  else {
                    local_1844 = commonLengthSmaller_6._4_4_;
                  }
                  dmsBtLow_6 = local_1844;
                  if (local_2ac == 2) {
                    local_1848 = (1 << ((byte)local_1844 & 0x1f)) - 1;
                  }
                  else {
                    local_1848 = 0;
                  }
                  local_3b0 = local_1848;
                  if ((local_2ac == 2) && (local_1848 < local_1834 - local_1838)) {
                    local_184c = local_1834 - local_1848;
                  }
                  else {
                    local_184c = local_1838;
                  }
                  bestLength_6._4_4_ = local_184c;
                  _repCode_6 = (BYTE *)(ulong)(local_2c0 - 1);
                  repOffset_6 = local_2bc + 3;
                  for (repIndex_6 = local_2bc; repIndex_6 < repOffset_6; repIndex_6 = repIndex_6 + 1
                      ) {
                    if (repIndex_6 == 3) {
                      local_1850 = *local_2b8 - 1;
                    }
                    else {
                      local_1850 = local_2b8[repIndex_6];
                    }
                    repLen_6 = local_1850;
                    local_3d0 = minMatch_7 - local_1850;
                    repMatch_6._4_4_ = 0;
                    if (local_1850 - 1 < minMatch_7 - dictEnd_6._4_4_) {
                      bVar29 = local_350 <= local_3d0;
                      UVar19 = ZSTD_readMINMATCH(local_2a0,hashTable_6._4_4_);
                      UVar24 = ZSTD_readMINMATCH(local_2a0 + -(ulong)repLen_6,hashTable_6._4_4_);
                      if (bVar29 && UVar19 == UVar24) {
                        sVar26 = ZSTD_count(local_2a0 + hashTable_6._4_4_,
                                            local_2a0 + ((ulong)hashTable_6._4_4_ - (ulong)repLen_6)
                                            ,local_2a8);
                        repMatch_6._4_4_ = (int)sVar26 + hashTable_6._4_4_;
                      }
                    }
                    else {
                      if (local_2ac == 2) {
                        local_1860 = dmsEnd_6 + ((ulong)local_3d0 - (ulong)dmsBtLog_6);
                      }
                      else {
                        local_1860 = pBStack_330 + local_3d0;
                      }
                      pBStack_3e0 = local_1860;
                      if ((local_2ac == 1) &&
                         (local_1850 - 1 < minMatch_7 - local_350 &&
                          2 < (dictEnd_6._4_4_ - 1) - local_3d0)) {
                        UVar19 = ZSTD_readMINMATCH(local_2a0,hashTable_6._4_4_);
                        UVar24 = ZSTD_readMINMATCH(pBStack_3e0,hashTable_6._4_4_);
                        if (UVar19 == UVar24) {
                          sVar26 = ZSTD_count_2segments
                                             (local_2a0 + hashTable_6._4_4_,
                                              pBStack_3e0 + hashTable_6._4_4_,local_2a8,
                                              prefixStart_7,_windowLow_6);
                          repMatch_6._4_4_ = (int)sVar26 + hashTable_6._4_4_;
                        }
                      }
                      if ((local_2ac == 2) &&
                         (repLen_6 - 1 < minMatch_7 - (dmsHashLog_6 + dmsBtLog_6) &&
                          2 < (dictEnd_6._4_4_ - 1) - local_3d0)) {
                        UVar19 = ZSTD_readMINMATCH(local_2a0,hashTable_6._4_4_);
                        UVar24 = ZSTD_readMINMATCH(pBStack_3e0,hashTable_6._4_4_);
                        if (UVar19 == UVar24) {
                          sVar26 = ZSTD_count_2segments
                                             (local_2a0 + hashTable_6._4_4_,
                                              pBStack_3e0 + hashTable_6._4_4_,local_2a8,
                                              _dmsLowLimit_6,_windowLow_6);
                          repMatch_6._4_4_ = (int)sVar26 + hashTable_6._4_4_;
                        }
                      }
                    }
                    if (_repCode_6 < (BYTE *)(ulong)repMatch_6._4_4_) {
                      _repCode_6 = (BYTE *)(ulong)repMatch_6._4_4_;
                      local_288[dms_6._4_4_].off = repIndex_6 - local_2bc;
                      local_288[dms_6._4_4_].len = repMatch_6._4_4_;
                      dms_6._4_4_ = dms_6._4_4_ + 1;
                      UVar19 = dms_6._4_4_;
                      if (base_9._4_4_ < repMatch_6._4_4_ ||
                          local_2a0 + repMatch_6._4_4_ == local_2a8) goto LAB_00d05e0d;
                    }
                  }
                  if (((cParams_9._4_4_ == 3) && (_repCode_6 < (BYTE *)0x3)) &&
                     (mlen_6._4_4_ = ZSTD_insertAndFindFirstIndexHash3
                                               (local_290,local_298,local_2a0),
                     smallerPtr_6._4_4_ <= mlen_6._4_4_ && minMatch_7 - mlen_6._4_4_ < 0x40000)) {
                    if (((local_2ac == 0) || (local_2ac == 2)) || (dictEnd_6._4_4_ <= mlen_6._4_4_))
                    {
                      match_25 = _hashLog_6 + mlen_6._4_4_;
                      match_24 = (BYTE *)ZSTD_count(local_2a0,match_25,local_2a8);
                    }
                    else {
                      nextPtr_12 = (U32 *)(pBStack_330 + mlen_6._4_4_);
                      match_24 = (BYTE *)ZSTD_count_2segments
                                                   (local_2a0,(BYTE *)nextPtr_12,local_2a8,
                                                    prefixStart_7,_windowLow_6);
                    }
                    if (match_24 < (BYTE *)(ulong)cParams_9._4_4_) goto LAB_00d05651;
                    _repCode_6 = match_24;
                    local_288->off = (minMatch_7 - mlen_6._4_4_) + 2;
                    local_288->len = (U32)match_24;
                    dms_6._4_4_ = 1;
                    if (match_24 <= (BYTE *)(ulong)base_9._4_4_ &&
                        local_2a0 + (long)match_24 != local_2a8) goto LAB_00d05651;
                    local_290->nextToUpdate = minMatch_7 + 1;
                    local_27c = 1;
                    UVar19 = local_27c;
                  }
                  else {
LAB_00d05651:
                    *(U32 *)(h_6 + sStack_300 * 4) = minMatch_7;
                    while (iVar22 = (int)dms_6 + -1, bVar29 = (int)dms_6 != 0, dms_6._0_4_ = iVar22,
                          bVar29 && smallerPtr_6._4_4_ <= bt_6._4_4_) {
                      match_26 = (BYTE *)(_btMask_6 +
                                         ((bt_6._4_4_ & (uint)commonLengthSmaller_6) << 1));
                      if (commonLengthLarger_6 < dictBase_6) {
                        local_1878 = (BYTE *)commonLengthLarger_6;
                      }
                      else {
                        local_1878 = dictBase_6;
                      }
                      dmsH_6 = (size_t)local_1878;
                      if (((local_2ac == 0) || (local_2ac == 2)) ||
                         ((BYTE *)(ulong)dictEnd_6._4_4_ <= local_1878 + bt_6._4_4_)) {
                        matchLength_12 = (size_t)(_hashLog_6 + bt_6._4_4_);
                        sVar26 = ZSTD_count(local_2a0 + (long)local_1878,
                                            (BYTE *)(matchLength_12 + (long)local_1878),local_2a8);
                        dmsH_6 = sVar26 + dmsH_6;
                      }
                      else {
                        matchLength_12 = (size_t)(pBStack_330 + bt_6._4_4_);
                        sVar26 = ZSTD_count_2segments
                                           (local_2a0 + (long)local_1878,
                                            (BYTE *)(matchLength_12 + (long)local_1878),local_2a8,
                                            prefixStart_7,_windowLow_6);
                        dmsH_6 = sVar26 + dmsH_6;
                        if ((ulong)dictEnd_6._4_4_ <= bt_6._4_4_ + dmsH_6) {
                          matchLength_12 = (size_t)(_hashLog_6 + bt_6._4_4_);
                        }
                      }
                      if (_repCode_6 < dmsH_6) {
                        if (mnum_6 - bt_6._4_4_ < dmsH_6) {
                          mnum_6 = bt_6._4_4_ + (U32)dmsH_6;
                        }
                        _repCode_6 = (BYTE *)dmsH_6;
                        local_288[dms_6._4_4_].off = (minMatch_7 - bt_6._4_4_) + 2;
                        local_288[dms_6._4_4_].len = (U32)dmsH_6;
                        dms_6._4_4_ = dms_6._4_4_ + 1;
                        if (0x1000 < dmsH_6 || local_2a0 + dmsH_6 == local_2a8) {
                          if (local_2ac == 2) {
                            dms_6._0_4_ = 0;
                          }
                          break;
                        }
                      }
                      if (*(byte *)(matchLength_12 + dmsH_6) < local_2a0[dmsH_6]) {
                        *largerPtr_6 = bt_6._4_4_;
                        commonLengthLarger_6 = dmsH_6;
                        if (bt_6._4_4_ <= matchLow_6) {
                          largerPtr_6 = &nbCompares_6;
                          break;
                        }
                        largerPtr_6 = (U32 *)(match_26 + 4);
                        bt_6._4_4_ = *(uint *)(match_26 + 4);
                      }
                      else {
                        *_dummy32_6 = bt_6._4_4_;
                        dictBase_6 = (BYTE *)dmsH_6;
                        if (bt_6._4_4_ <= matchLow_6) {
                          _dummy32_6 = &nbCompares_6;
                          break;
                        }
                        _dummy32_6 = (U32 *)match_26;
                        bt_6._4_4_ = *(uint *)match_26;
                      }
                    }
                    *_dummy32_6 = 0;
                    *largerPtr_6 = 0;
                    if ((local_2ac == 2) && ((int)dms_6 != 0)) {
                      local_270 = local_2a0;
                      local_274 = dmsBtMask_6;
                      local_278 = cParams_9._4_4_;
                      switch(cParams_9._4_4_) {
                      default:
                        local_268 = ZSTD_hash4Ptr(local_2a0,dmsBtMask_6);
                        break;
                      case 5:
                        local_268 = ZSTD_hash5Ptr(local_2a0,dmsBtMask_6);
                        break;
                      case 6:
                        local_268 = ZSTD_hash6Ptr(local_2a0,dmsBtMask_6);
                        break;
                      case 7:
                        local_268 = ZSTD_hash7Ptr(local_2a0,dmsBtMask_6);
                        break;
                      case 8:
                        local_268 = ZSTD_hash8Ptr(local_2a0,dmsBtMask_6);
                      }
                      sStack_420 = local_268;
                      dmsBt_6._4_4_ = *(uint *)(*(long *)&dmsCParams_6[3].searchLog + local_268 * 4)
                      ;
                      nextPtr_13 = *(U32 **)(dmsCParams_6 + 4);
                      dictBase_6 = (BYTE *)0x0;
                      commonLengthLarger_6 = 0;
                      while (iVar22 = (int)dms_6 + -1, bVar29 = (int)dms_6 != 0,
                            dms_6._0_4_ = iVar22, bVar29 && dmsHashLog_6 < dmsBt_6._4_4_) {
                        matchLength_13 = (size_t)(nextPtr_13 + ((dmsBt_6._4_4_ & local_3b0) << 1));
                        if (commonLengthLarger_6 < dictBase_6) {
                          local_1890 = (BYTE *)commonLengthLarger_6;
                        }
                        else {
                          local_1890 = dictBase_6;
                        }
                        match_27 = local_1890;
                        local_448 = dmsEnd_6 + dmsBt_6._4_4_;
                        sVar26 = ZSTD_count_2segments
                                           (local_2a0 + (long)local_1890,
                                            local_448 + (long)local_1890,local_2a8,_dmsLowLimit_6,
                                            _windowLow_6);
                        match_27 = match_27 + sVar26;
                        if ((BYTE *)(ulong)dmsIndexDelta_6 <= match_27 + dmsBt_6._4_4_) {
                          local_448 = _hashLog_6 + (ulong)dmsBtLog_6 + (ulong)dmsBt_6._4_4_;
                        }
                        if (_repCode_6 < match_27) {
                          bt_6._4_4_ = dmsBt_6._4_4_ + dmsBtLog_6;
                          if ((BYTE *)(ulong)(mnum_6 - bt_6._4_4_) < match_27) {
                            mnum_6 = bt_6._4_4_ + (U32)match_27;
                          }
                          local_288[dms_6._4_4_].off = (minMatch_7 - bt_6._4_4_) + 2;
                          local_288[dms_6._4_4_].len = (U32)match_27;
                          dms_6._4_4_ = dms_6._4_4_ + 1;
                          _repCode_6 = match_27;
                          if ((BYTE *)0x1000 < match_27 || local_2a0 + (long)match_27 == local_2a8)
                          break;
                        }
                        if (dmsBt_6._4_4_ <= bestLength_6._4_4_) break;
                        if (local_448[(long)match_27] < local_2a0[(long)match_27]) {
                          dmsBt_6._4_4_ = *(uint *)(matchLength_13 + 4);
                          commonLengthLarger_6 = (size_t)match_27;
                        }
                        else {
                          dmsBt_6._4_4_ = *(uint *)matchLength_13;
                          dictBase_6 = match_27;
                        }
                      }
                    }
                    local_290->nextToUpdate = mnum_6 - 8;
                    local_27c = dms_6._4_4_;
                    UVar19 = local_27c;
                  }
LAB_00d05e0d:
                  local_27c = UVar19;
                  local_11a0 = local_27c;
                  dms_6._4_4_ = local_27c;
                  break;
                case 6:
                case 7:
                  local_88 = local_11a8;
                  local_90 = local_11b0;
                  local_98 = local_11b8;
                  local_a0 = local_11c0;
                  local_a8 = local_11c8;
                  local_ac = local_11cc;
                  local_b8 = local_11d8;
                  local_bc = cParams_6._4_4_;
                  local_c0 = (uint)cParams_6;
                  cParams_10._4_4_ = 6;
                  pZStack_d0 = &local_11b0->cParams;
                  if ((local_11b0->cParams).targetLength < 0xfff) {
                    local_1894 = (local_11b0->cParams).targetLength;
                  }
                  else {
                    local_1894 = 0xfff;
                  }
                  base_10._4_4_ = local_1894;
                  _hashLog_7 = (local_11b0->window).base;
                  minMatch_8 = (int)local_6a0 - hashLog_7;
                  local_e8 = (local_11b0->cParams).hashLog;
                  hashTable_7._4_4_ = 4;
                  h_7 = (size_t)local_11b0->hashTable;
                  local_58 = local_11c0;
                  local_60 = 6;
                  local_5c = local_e8;
                  sStack_100 = ZSTD_hash6Ptr(local_11c0,local_e8);
                  bt_7._4_4_ = *(uint *)(h_7 + sStack_100 * 4);
                  _btMask_7 = local_90->chainTable;
                  commonLengthSmaller_7._4_4_ = pZStack_d0->chainLog - 1;
                  commonLengthSmaller_7._0_4_ =
                       (1 << ((byte)commonLengthSmaller_7._4_4_ & 0x1f)) - 1;
                  commonLengthLarger_7 = 0;
                  dictBase_7 = (BYTE *)0x0;
                  pBStack_130 = (local_90->window).dictBase;
                  dictEnd_7._4_4_ = (local_90->window).dictLimit;
                  prefixStart_8 = pBStack_130 + dictEnd_7._4_4_;
                  _windowLow_7 = _hashLog_7 + dictEnd_7._4_4_;
                  if ((uint)commonLengthSmaller_7 < minMatch_8) {
                    local_18a4 = minMatch_8 - (uint)commonLengthSmaller_7;
                  }
                  else {
                    local_18a4 = 0;
                  }
                  matchLow_7 = local_18a4;
                  local_50 = sStack_100;
                  local_150 = ZSTD_getLowestMatchIndex(local_90,minMatch_8,pZStack_d0->windowLog);
                  local_18a8 = local_150;
                  if (local_150 == 0) {
                    local_18a8 = 1;
                  }
                  smallerPtr_7._4_4_ = local_18a8;
                  largerPtr_7 = _btMask_7 + ((minMatch_8 & (uint)commonLengthSmaller_7) << 1);
                  _dummy32_7 = _btMask_7 +
                               (ulong)((minMatch_8 & (uint)commonLengthSmaller_7) << 1) + 1;
                  mnum_7 = minMatch_8 + 9;
                  dms_7._4_4_ = 0;
                  dms_7._0_4_ = 1 << ((byte)pZStack_d0->searchLog & 0x1f);
                  if (local_ac == 2) {
                    local_18b0 = local_90->dictMatchState;
                  }
                  else {
                    local_18b0 = (ZSTD_matchState_t *)0x0;
                  }
                  dmsCParams_7 = (ZSTD_compressionParameters *)local_18b0;
                  if (local_ac == 2) {
                    local_18b8 = &local_18b0->cParams;
                  }
                  else {
                    local_18b8 = (ZSTD_compressionParameters *)0x0;
                  }
                  dmsBase_7 = (BYTE *)local_18b8;
                  if (local_ac == 2) {
                    local_18c0 = (local_18b0->window).base;
                  }
                  else {
                    local_18c0 = (BYTE *)0x0;
                  }
                  dmsEnd_7 = local_18c0;
                  if (local_ac == 2) {
                    local_18c8 = (local_18b0->window).nextSrc;
                  }
                  else {
                    local_18c8 = (BYTE *)0x0;
                  }
                  _dmsLowLimit_7 = local_18c8;
                  if (local_ac == 2) {
                    local_18cc = (int)local_18c8 - (int)local_18c0;
                  }
                  else {
                    local_18cc = 0;
                  }
                  dmsIndexDelta_7 = local_18cc;
                  if (local_ac == 2) {
                    local_18d0 = (local_18b0->window).lowLimit;
                  }
                  else {
                    local_18d0 = 0;
                  }
                  dmsHashLog_7 = local_18d0;
                  if (local_ac == 2) {
                    local_18d4 = local_150 - local_18cc;
                  }
                  else {
                    local_18d4 = 0;
                  }
                  dmsBtLog_7 = local_18d4;
                  if (local_ac == 2) {
                    local_18d8 = local_18b8->hashLog;
                  }
                  else {
                    local_18d8 = local_e8;
                  }
                  dmsBtMask_7 = local_18d8;
                  if (local_ac == 2) {
                    local_18dc = local_18b8->chainLog - 1;
                  }
                  else {
                    local_18dc = commonLengthSmaller_7._4_4_;
                  }
                  dmsBtLow_7 = local_18dc;
                  if (local_ac == 2) {
                    local_18e0 = (1 << ((byte)local_18dc & 0x1f)) - 1;
                  }
                  else {
                    local_18e0 = 0;
                  }
                  local_1b0 = local_18e0;
                  if ((local_ac == 2) && (local_18e0 < local_18cc - local_18d0)) {
                    local_18e4 = local_18cc - local_18e0;
                  }
                  else {
                    local_18e4 = local_18d0;
                  }
                  bestLength_7._4_4_ = local_18e4;
                  _repCode_7 = (BYTE *)(ulong)(local_c0 - 1);
                  repOffset_7 = local_bc + 3;
                  for (repIndex_7 = local_bc; repIndex_7 < repOffset_7; repIndex_7 = repIndex_7 + 1)
                  {
                    if (repIndex_7 == 3) {
                      local_18e8 = *local_b8 - 1;
                    }
                    else {
                      local_18e8 = local_b8[repIndex_7];
                    }
                    repLen_7 = local_18e8;
                    local_1d0 = minMatch_8 - local_18e8;
                    repMatch_7._4_4_ = 0;
                    if (local_18e8 - 1 < minMatch_8 - dictEnd_7._4_4_) {
                      bVar29 = local_150 <= local_1d0;
                      UVar19 = ZSTD_readMINMATCH(local_a0,hashTable_7._4_4_);
                      UVar24 = ZSTD_readMINMATCH(local_a0 + -(ulong)repLen_7,hashTable_7._4_4_);
                      if (bVar29 && UVar19 == UVar24) {
                        sVar26 = ZSTD_count(local_a0 + hashTable_7._4_4_,
                                            local_a0 + ((ulong)hashTable_7._4_4_ - (ulong)repLen_7),
                                            local_a8);
                        repMatch_7._4_4_ = (int)sVar26 + hashTable_7._4_4_;
                      }
                    }
                    else {
                      if (local_ac == 2) {
                        local_18f8 = dmsEnd_7 + ((ulong)local_1d0 - (ulong)dmsBtLog_7);
                      }
                      else {
                        local_18f8 = pBStack_130 + local_1d0;
                      }
                      pBStack_1e0 = local_18f8;
                      if ((local_ac == 1) &&
                         (local_18e8 - 1 < minMatch_8 - local_150 &&
                          2 < (dictEnd_7._4_4_ - 1) - local_1d0)) {
                        UVar19 = ZSTD_readMINMATCH(local_a0,hashTable_7._4_4_);
                        UVar24 = ZSTD_readMINMATCH(pBStack_1e0,hashTable_7._4_4_);
                        if (UVar19 == UVar24) {
                          sVar26 = ZSTD_count_2segments
                                             (local_a0 + hashTable_7._4_4_,
                                              pBStack_1e0 + hashTable_7._4_4_,local_a8,prefixStart_8
                                              ,_windowLow_7);
                          repMatch_7._4_4_ = (int)sVar26 + hashTable_7._4_4_;
                        }
                      }
                      if ((local_ac == 2) &&
                         (repLen_7 - 1 < minMatch_8 - (dmsHashLog_7 + dmsBtLog_7) &&
                          2 < (dictEnd_7._4_4_ - 1) - local_1d0)) {
                        UVar19 = ZSTD_readMINMATCH(local_a0,hashTable_7._4_4_);
                        UVar24 = ZSTD_readMINMATCH(pBStack_1e0,hashTable_7._4_4_);
                        if (UVar19 == UVar24) {
                          sVar26 = ZSTD_count_2segments
                                             (local_a0 + hashTable_7._4_4_,
                                              pBStack_1e0 + hashTable_7._4_4_,local_a8,
                                              _dmsLowLimit_7,_windowLow_7);
                          repMatch_7._4_4_ = (int)sVar26 + hashTable_7._4_4_;
                        }
                      }
                    }
                    if (_repCode_7 < (BYTE *)(ulong)repMatch_7._4_4_) {
                      _repCode_7 = (BYTE *)(ulong)repMatch_7._4_4_;
                      local_88[dms_7._4_4_].off = repIndex_7 - local_bc;
                      local_88[dms_7._4_4_].len = repMatch_7._4_4_;
                      dms_7._4_4_ = dms_7._4_4_ + 1;
                      UVar19 = dms_7._4_4_;
                      if (base_10._4_4_ < repMatch_7._4_4_ ||
                          local_a0 + repMatch_7._4_4_ == local_a8) goto LAB_00d07187;
                    }
                  }
                  if (((cParams_10._4_4_ == 3) && (_repCode_7 < (BYTE *)0x3)) &&
                     (mlen_7._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_90,local_98,local_a0),
                     smallerPtr_7._4_4_ <= mlen_7._4_4_ && minMatch_8 - mlen_7._4_4_ < 0x40000)) {
                    if (((local_ac == 0) || (local_ac == 2)) || (dictEnd_7._4_4_ <= mlen_7._4_4_)) {
                      match_29 = _hashLog_7 + mlen_7._4_4_;
                      match_28 = (BYTE *)ZSTD_count(local_a0,match_29,local_a8);
                    }
                    else {
                      nextPtr_14 = (U32 *)(pBStack_130 + mlen_7._4_4_);
                      match_28 = (BYTE *)ZSTD_count_2segments
                                                   (local_a0,(BYTE *)nextPtr_14,local_a8,
                                                    prefixStart_8,_windowLow_7);
                    }
                    if (match_28 < (BYTE *)(ulong)cParams_10._4_4_) goto LAB_00d06a16;
                    _repCode_7 = match_28;
                    local_88->off = (minMatch_8 - mlen_7._4_4_) + 2;
                    local_88->len = (U32)match_28;
                    dms_7._4_4_ = 1;
                    if (match_28 <= (BYTE *)(ulong)base_10._4_4_ &&
                        local_a0 + (long)match_28 != local_a8) goto LAB_00d06a16;
                    local_90->nextToUpdate = minMatch_8 + 1;
                    local_7c = 1;
                    UVar19 = local_7c;
                  }
                  else {
LAB_00d06a16:
                    *(U32 *)(h_7 + sStack_100 * 4) = minMatch_8;
                    while (iVar22 = (int)dms_7 + -1, bVar29 = (int)dms_7 != 0, dms_7._0_4_ = iVar22,
                          bVar29 && smallerPtr_7._4_4_ <= bt_7._4_4_) {
                      match_30 = (BYTE *)(_btMask_7 +
                                         ((bt_7._4_4_ & (uint)commonLengthSmaller_7) << 1));
                      if (commonLengthLarger_7 < dictBase_7) {
                        local_1910 = (BYTE *)commonLengthLarger_7;
                      }
                      else {
                        local_1910 = dictBase_7;
                      }
                      dmsH_7 = (size_t)local_1910;
                      if (((local_ac == 0) || (local_ac == 2)) ||
                         ((BYTE *)(ulong)dictEnd_7._4_4_ <= local_1910 + bt_7._4_4_)) {
                        matchLength_14 = (size_t)(_hashLog_7 + bt_7._4_4_);
                        sVar26 = ZSTD_count(local_a0 + (long)local_1910,
                                            (BYTE *)(matchLength_14 + (long)local_1910),local_a8);
                        dmsH_7 = sVar26 + dmsH_7;
                      }
                      else {
                        matchLength_14 = (size_t)(pBStack_130 + bt_7._4_4_);
                        sVar26 = ZSTD_count_2segments
                                           (local_a0 + (long)local_1910,
                                            (BYTE *)(matchLength_14 + (long)local_1910),local_a8,
                                            prefixStart_8,_windowLow_7);
                        dmsH_7 = sVar26 + dmsH_7;
                        if ((ulong)dictEnd_7._4_4_ <= bt_7._4_4_ + dmsH_7) {
                          matchLength_14 = (size_t)(_hashLog_7 + bt_7._4_4_);
                        }
                      }
                      if (_repCode_7 < dmsH_7) {
                        if (mnum_7 - bt_7._4_4_ < dmsH_7) {
                          mnum_7 = bt_7._4_4_ + (U32)dmsH_7;
                        }
                        _repCode_7 = (BYTE *)dmsH_7;
                        local_88[dms_7._4_4_].off = (minMatch_8 - bt_7._4_4_) + 2;
                        local_88[dms_7._4_4_].len = (U32)dmsH_7;
                        dms_7._4_4_ = dms_7._4_4_ + 1;
                        if (0x1000 < dmsH_7 || local_a0 + dmsH_7 == local_a8) {
                          if (local_ac == 2) {
                            dms_7._0_4_ = 0;
                          }
                          break;
                        }
                      }
                      if (*(byte *)(matchLength_14 + dmsH_7) < local_a0[dmsH_7]) {
                        *largerPtr_7 = bt_7._4_4_;
                        commonLengthLarger_7 = dmsH_7;
                        if (bt_7._4_4_ <= matchLow_7) {
                          largerPtr_7 = &nbCompares_7;
                          break;
                        }
                        largerPtr_7 = (U32 *)(match_30 + 4);
                        bt_7._4_4_ = *(uint *)(match_30 + 4);
                      }
                      else {
                        *_dummy32_7 = bt_7._4_4_;
                        dictBase_7 = (BYTE *)dmsH_7;
                        if (bt_7._4_4_ <= matchLow_7) {
                          _dummy32_7 = &nbCompares_7;
                          break;
                        }
                        _dummy32_7 = (U32 *)match_30;
                        bt_7._4_4_ = *(uint *)match_30;
                      }
                    }
                    *_dummy32_7 = 0;
                    *largerPtr_7 = 0;
                    if ((local_ac == 2) && ((int)dms_7 != 0)) {
                      local_70 = local_a0;
                      local_74 = dmsBtMask_7;
                      local_78 = cParams_10._4_4_;
                      switch(cParams_10._4_4_) {
                      default:
                        local_68 = ZSTD_hash4Ptr(local_a0,dmsBtMask_7);
                        break;
                      case 5:
                        local_68 = ZSTD_hash5Ptr(local_a0,dmsBtMask_7);
                        break;
                      case 6:
                        local_68 = ZSTD_hash6Ptr(local_a0,dmsBtMask_7);
                        break;
                      case 7:
                        local_68 = ZSTD_hash7Ptr(local_a0,dmsBtMask_7);
                        break;
                      case 8:
                        local_68 = ZSTD_hash8Ptr(local_a0,dmsBtMask_7);
                      }
                      sStack_220 = local_68;
                      dmsBt_7._4_4_ = *(uint *)(*(long *)&dmsCParams_7[3].searchLog + local_68 * 4);
                      nextPtr_15 = *(U32 **)(dmsCParams_7 + 4);
                      dictBase_7 = (BYTE *)0x0;
                      commonLengthLarger_7 = 0;
                      while (iVar22 = (int)dms_7 + -1, bVar29 = (int)dms_7 != 0,
                            dms_7._0_4_ = iVar22, bVar29 && dmsHashLog_7 < dmsBt_7._4_4_) {
                        matchLength_15 = (size_t)(nextPtr_15 + ((dmsBt_7._4_4_ & local_1b0) << 1));
                        if (commonLengthLarger_7 < dictBase_7) {
                          local_1928 = (BYTE *)commonLengthLarger_7;
                        }
                        else {
                          local_1928 = dictBase_7;
                        }
                        match_31 = local_1928;
                        local_248 = dmsEnd_7 + dmsBt_7._4_4_;
                        sVar26 = ZSTD_count_2segments
                                           (local_a0 + (long)local_1928,local_248 + (long)local_1928
                                            ,local_a8,_dmsLowLimit_7,_windowLow_7);
                        match_31 = match_31 + sVar26;
                        if ((BYTE *)(ulong)dmsIndexDelta_7 <= match_31 + dmsBt_7._4_4_) {
                          local_248 = _hashLog_7 + (ulong)dmsBtLog_7 + (ulong)dmsBt_7._4_4_;
                        }
                        if (_repCode_7 < match_31) {
                          bt_7._4_4_ = dmsBt_7._4_4_ + dmsBtLog_7;
                          if ((BYTE *)(ulong)(mnum_7 - bt_7._4_4_) < match_31) {
                            mnum_7 = bt_7._4_4_ + (U32)match_31;
                          }
                          local_88[dms_7._4_4_].off = (minMatch_8 - bt_7._4_4_) + 2;
                          local_88[dms_7._4_4_].len = (U32)match_31;
                          dms_7._4_4_ = dms_7._4_4_ + 1;
                          _repCode_7 = match_31;
                          if ((BYTE *)0x1000 < match_31 || local_a0 + (long)match_31 == local_a8)
                          break;
                        }
                        if (dmsBt_7._4_4_ <= bestLength_7._4_4_) break;
                        if (local_248[(long)match_31] < local_a0[(long)match_31]) {
                          dmsBt_7._4_4_ = *(uint *)(matchLength_15 + 4);
                          commonLengthLarger_7 = (size_t)match_31;
                        }
                        else {
                          dmsBt_7._4_4_ = *(uint *)matchLength_15;
                          dictBase_7 = match_31;
                        }
                      }
                    }
                    local_90->nextToUpdate = mnum_7 - 8;
                    local_7c = dms_7._4_4_;
                    UVar19 = local_7c;
                  }
LAB_00d07187:
                  local_7c = UVar19;
                  local_11a0 = local_7c;
                  dms_7._4_4_ = local_7c;
                }
              }
              maxML_1 = local_11a0;
              ZSTD_optLdm_processMatchCandidate
                        ((ZSTD_optLdm_t *)&last_pos,matches_00,&maxML_1,iVar18 - (int)ip,
                         (int)ilimit - iVar18);
              if (maxML_1 != 0) {
                lastSequence.price = matches_00[maxML_1 - 1].len;
                if ((nextToUpdate3 < (uint)lastSequence.price) ||
                   (0xfff < litlen + lastSequence.price)) {
                  optLdm._52_4_ = matches_00[maxML_1 - 1].off;
                  lastSequence.off = basePrice;
                  if (pZVar1[litlen].mlen == 0) {
                    local_192c = pZVar1[litlen].litlen;
                  }
                  else {
                    local_192c = 0;
                  }
                  local_192c = litlen - local_192c;
                  sol_00.mlen = lastSequence.mlen;
                  sol_00.litlen = lastSequence.litlen;
                  sol_00.price = lastSequence.price;
                  sol_00.off = basePrice;
                  sol_00.rep[0] = lastSequence.rep[0];
                  sol_00.rep[1] = (int)in_stack_ffffffffffffe694;
                  sol_00.rep[2] = (int)((ulong)in_stack_ffffffffffffe694 >> 0x20);
                  litlen = local_192c;
                  UVar19 = ZSTD_totalLen(sol_00);
                  ll0 = local_192c + UVar19;
                  if (0x1000 < litlen) {
                    litlen = 0;
                  }
                  goto LAB_00d07823;
                }
                for (offset_1 = 0; offset_1 < maxML_1; offset_1 = offset_1 + 1) {
                  UVar19 = matches_00[offset_1].off;
                  price_2 = matches_00[offset_1].len;
                  if (offset_1 == 0) {
                    local_1934 = local_1270;
                  }
                  else {
                    local_1934 = matches_00[offset_1 - 1].len + 1;
                  }
                  for (; UVar24 = matchNb_1, local_1934 <= (uint)price_2; price_2 = price_2 + -1) {
                    uVar23 = litlen + price_2;
                    local_1094 = price_2;
                    _price_3 = istart;
                    offCode_1 = optStatePtr._4_4_;
                    local_1090 = UVar19;
                    mlCode_1 = ZSTD_highbit32(UVar19 + 1);
                    local_10b0 = local_1094 - 3;
                    if (*(int *)(_price_3 + 0x50) == 1) {
                      if (offCode_1 == 0) {
                        local_193c = ZSTD_bitWeight(local_10b0);
                      }
                      else {
                        local_193c = ZSTD_fracWeight(local_10b0);
                      }
                      local_108c = local_193c + (mlCode_1 + 0x10) * 0x100;
                    }
                    else {
                      iVar22 = mlCode_1 * 0x100;
                      iVar18 = *(int *)(_price_3 + 0x4c);
                      if (offCode_1 == 0) {
                        local_1948 = ZSTD_bitWeight(*(U32 *)(*(long *)(_price_3 + 0x18) +
                                                            (ulong)mlCode_1 * 4));
                      }
                      else {
                        local_1948 = ZSTD_fracWeight(*(U32 *)(*(long *)(_price_3 + 0x18) +
                                                             (ulong)mlCode_1 * 4));
                      }
                      mlBase_1 = iVar22 + (iVar18 - local_1948);
                      if (((int)offCode_1 < 2) && (0x13 < mlCode_1)) {
                        mlBase_1 = (mlCode_1 - 0x13) * 0x200 + mlBase_1;
                      }
                      local_10b4 = ZSTD_MLcode(local_10b0);
                      UVar21 = ML_bits[local_10b4];
                      iVar18 = *(int *)(_price_3 + 0x48);
                      if (offCode_1 == 0) {
                        local_1954 = ZSTD_bitWeight(*(U32 *)(*(long *)(_price_3 + 0x10) +
                                                            (ulong)local_10b4 * 4));
                      }
                      else {
                        local_1954 = ZSTD_fracWeight(*(U32 *)(*(long *)(_price_3 + 0x10) +
                                                             (ulong)local_10b4 * 4));
                      }
                      mlBase_1 = UVar21 * 0x100 + (iVar18 - local_1954) + mlBase_1 + 0x33;
                      local_108c = mlBase_1;
                    }
                    if ((ll0 < uVar23) || ((int)(UVar24 + local_108c) < pZVar1[uVar23].price)) {
                      for (; ll0 < uVar23; ll0 = ll0 + 1) {
                        pZVar1[ll0 + 1].price = 0x40000000;
                      }
                      pZVar1[uVar23].mlen = price_2;
                      pZVar1[uVar23].off = UVar19;
                      pZVar1[uVar23].litlen = basePrice;
                      pZVar1[uVar23].price = UVar24 + local_108c;
                    }
                    else if (optStatePtr._4_4_ == 0) break;
                  }
                }
              }
            }
          }
        }
        UVar19 = ll0;
        pZVar27 = pZVar1 + ll0;
        optLdm.offset = pZVar27->price;
        optLdm._52_4_ = pZVar27->off;
        lastSequence.price = pZVar27->mlen;
        lastSequence.off = pZVar27->litlen;
        lastSequence.mlen = pZVar27->rep[0];
        lastSequence.litlen = pZVar27->rep[1];
        lastSequence.rep[0] = pZVar27->rep[2];
        uVar7 = pZVar27->mlen;
        uVar8 = pZVar27->litlen;
        uVar9 = pZVar27->rep[0];
        uVar10 = pZVar27->rep[1];
        uVar11 = pZVar27->rep[2];
        sol_02.rep[0] = uVar11;
        sol_02.litlen = uVar10;
        sol_02.mlen = uVar9;
        sol_02.off = uVar8;
        sol_02.price = uVar7;
        uVar2 = pZVar27->mlen;
        uVar3 = pZVar27->litlen;
        uVar4 = pZVar27->rep[0];
        uVar5 = pZVar27->rep[1];
        uVar6 = pZVar27->rep[2];
        sol_01.rep[0] = uVar6;
        sol_01.litlen = uVar5;
        sol_01.mlen = uVar4;
        sol_01.off = uVar3;
        sol_01.price = uVar2;
        sol_01.rep[1] = (int)in_stack_ffffffffffffe694;
        sol_01.rep[2] = (int)((ulong)in_stack_ffffffffffffe694 >> 0x20);
        UVar24 = ZSTD_totalLen(sol_01);
        local_195c = ll0;
        if (UVar24 < UVar19) {
          sol_02.rep[1] = (int)in_stack_ffffffffffffe694;
          sol_02.rep[2] = (int)((ulong)in_stack_ffffffffffffe694 >> 0x20);
          UVar19 = ZSTD_totalLen(sol_02);
          local_195c = local_195c - UVar19;
        }
        else {
          local_195c = 0;
        }
        litlen = local_195c;
      }
LAB_00d07823:
      piVar17 = local_1208;
      UVar19 = litlen;
      if (lastSequence.price == 0) {
        *(undefined8 *)local_1208 = *(undefined8 *)pZVar1[litlen].rep;
        piVar17[2] = pZVar1[UVar19].rep[2];
      }
      else {
        rVar30 = ZSTD_updateRep(pZVar1[litlen].rep,optLdm._52_4_,(uint)(lastSequence.off == 0));
        piVar17 = local_1208;
        _storeStart = rVar30.rep._0_8_;
        local_1398 = rVar30.rep[2];
        *(undefined8 *)local_1208 = _storeStart;
        piVar17[2] = local_1398;
      }
      uVar23 = litlen + 1;
      local_13ac = litlen;
      pZVar27 = pZVar1 + uVar23;
      pZVar27->price = optLdm.offset;
      pZVar27->off = optLdm._52_4_;
      pZVar27->mlen = lastSequence.price;
      pZVar27->litlen = lastSequence.off;
      pZVar27->rep[0] = lastSequence.mlen;
      pZVar27->rep[1] = lastSequence.litlen;
      pZVar27->rep[2] = lastSequence.rep[0];
      backDist = uVar23;
      while (local_13ac != 0) {
        pZVar27 = pZVar1 + local_13ac;
        uVar12 = pZVar27->mlen;
        uVar13 = pZVar27->litlen;
        uVar14 = pZVar27->rep[0];
        uVar15 = pZVar27->rep[1];
        uVar16 = pZVar27->rep[2];
        sol_03.rep[0] = uVar16;
        sol_03.litlen = uVar15;
        sol_03.mlen = uVar14;
        sol_03.off = uVar13;
        sol_03.price = uVar12;
        sol_03.rep[1] = (int)in_stack_ffffffffffffe694;
        sol_03.rep[2] = (int)((ulong)in_stack_ffffffffffffe694 >> 0x20);
        UVar24 = ZSTD_totalLen(sol_03);
        backDist = backDist - 1;
        pZVar27 = pZVar1 + backDist;
        pZVar28 = pZVar1 + local_13ac;
        UVar19 = pZVar28->off;
        pZVar27->price = pZVar28->price;
        pZVar27->off = UVar19;
        UVar19 = pZVar28->litlen;
        pZVar27->mlen = pZVar28->mlen;
        pZVar27->litlen = UVar19;
        *(undefined8 *)pZVar27->rep = *(undefined8 *)pZVar28->rep;
        pZVar27->rep[2] = pZVar28->rep[2];
        if (UVar24 < local_13ac) {
          local_1964 = local_13ac - UVar24;
        }
        else {
          local_1964 = 0;
        }
        local_13ac = local_1964;
      }
      for (mlen_9 = backDist; mlen_9 <= uVar23; mlen_9 = mlen_9 + 1) {
        litLength = pZVar1[mlen_9].litlen;
        UVar19 = pZVar1[mlen_9].mlen;
        UVar24 = pZVar1[mlen_9].off;
        if (UVar19 == 0) {
          anchor = iend + litLength;
        }
        else {
          ZSTD_updateStats((optState_t *)istart,litLength,iend,UVar24,UVar19);
          local_1058 = (ulong)litLength;
          litLimit_w = (BYTE *)(ulong)(UVar19 - 3);
          local_1050 = local_1200;
          local_1060 = iend;
          local_1068 = ilimit;
          litEnd = ilimit + -0x20;
          local_1088 = iend + local_1058;
          local_106c = UVar24;
          if (litEnd < local_1088) {
            ZSTD_safecopyLiterals(local_1200->lit,iend,local_1088,litEnd);
          }
          else {
            ZSTD_copy16(local_1200->lit,iend);
            if (0x10 < local_1058) {
              oend = local_1050->lit + 0x10;
              op = local_1060 + 0x10;
              local_20 = local_1058 - 0x10;
              diff._4_4_ = 0;
              ip_1 = oend + -(long)op;
              local_48 = oend + local_20;
              local_18 = op;
              local_10 = oend;
              ZSTD_copy16(oend,op);
              if (0x10 < local_20) {
                oend = oend + 0x10;
                op = op + 0x10;
                do {
                  ZSTD_copy16(oend,op);
                  oend = oend + 0x10;
                  op = op + 0x10;
                  ZSTD_copy16(oend,op);
                  oend = oend + 0x10;
                  op = op + 0x10;
                } while (oend < local_48);
              }
            }
          }
          local_1050->lit = local_1050->lit + local_1058;
          if (0xffff < local_1058) {
            local_1050->longLengthType = ZSTD_llt_literalLength;
            local_1050->longLengthPos =
                 (U32)((long)local_1050->sequences - (long)local_1050->sequencesStart >> 3);
          }
          local_1050->sequences->litLength = (U16)local_1058;
          local_1050->sequences->offset = local_106c + 1;
          if ((BYTE *)0xffff < litLimit_w) {
            local_1050->longLengthType = ZSTD_llt_matchLength;
            local_1050->longLengthPos =
                 (U32)((long)local_1050->sequences - (long)local_1050->sequencesStart >> 3);
          }
          local_1050->sequences->matchLength = (U16)litLimit_w;
          local_1050->sequences = local_1050->sequences + 1;
          iend = iend + (litLength + UVar19);
          anchor = iend;
        }
      }
      ZSTD_setBasePrices((optState_t *)istart,optStatePtr._4_4_);
    }
  } while( true );
}

Assistant:

static void
ZSTD_initStats_ultra(ZSTD_matchState_t* ms,
                     seqStore_t* seqStore,
                     U32 rep[ZSTD_REP_NUM],
               const void* src, size_t srcSize)
{
    U32 tmpRep[ZSTD_REP_NUM];  /* updated rep codes will sink here */
    ZSTD_memcpy(tmpRep, rep, sizeof(tmpRep));

    DEBUGLOG(4, "ZSTD_initStats_ultra (srcSize=%zu)", srcSize);
    assert(ms->opt.litLengthSum == 0);    /* first block */
    assert(seqStore->sequences == seqStore->sequencesStart);   /* no ldm */
    assert(ms->window.dictLimit == ms->window.lowLimit);   /* no dictionary */
    assert(ms->window.dictLimit - ms->nextToUpdate <= 1);  /* no prefix (note: intentional overflow, defined as 2-complement) */

    ZSTD_compressBlock_opt_generic(ms, seqStore, tmpRep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);   /* generate stats into ms->opt*/

    /* invalidate first scan from history */
    ZSTD_resetSeqStore(seqStore);
    ms->window.base -= srcSize;
    ms->window.dictLimit += (U32)srcSize;
    ms->window.lowLimit = ms->window.dictLimit;
    ms->nextToUpdate = ms->window.dictLimit;

    /* re-inforce weight of collected statistics */
    ZSTD_upscaleStats(&ms->opt);
}